

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<4,4>::
     occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  int iVar6;
  __int_type_conflict _Var7;
  long lVar8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined8 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  byte bVar53;
  long lVar54;
  ulong uVar55;
  Geometry *pGVar56;
  Geometry *geometry;
  long lVar57;
  ulong uVar58;
  bool bVar59;
  undefined8 unaff_R13;
  ulong uVar60;
  long lVar61;
  byte bVar62;
  ulong uVar63;
  float fVar64;
  float fVar124;
  float fVar126;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar65;
  float fVar125;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar85 [16];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar130;
  float fVar131;
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined4 uVar132;
  vint4 bi_2;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined8 uVar138;
  vint4 bi_1;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  vint4 bi;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar148;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vint4 ai;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  vint4 ai_1;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar162;
  float fVar163;
  float fVar164;
  vint4 ai_2;
  undefined1 auVar165 [32];
  float fVar166;
  uint uVar167;
  float fVar169;
  float fVar170;
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  undefined1 auVar193 [64];
  undefined1 auVar194 [64];
  undefined1 auVar195 [64];
  RTCFilterFunctionNArguments args;
  undefined1 local_5b0 [16];
  Precalculations *local_598;
  ulong local_590;
  Geometry *local_588;
  RTCFilterFunctionNArguments local_580;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [32];
  LinearSpace3fa *local_4d0;
  Primitive *local_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_390 [16];
  undefined1 local_380 [16];
  undefined1 local_370 [8];
  float fStack_368;
  float fStack_364;
  undefined8 local_360;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined1 local_2f0 [16];
  undefined1 local_2e0 [16];
  float local_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined4 local_2c0;
  undefined4 uStack_2bc;
  undefined4 uStack_2b8;
  undefined4 uStack_2b4;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined1 local_2a0 [16];
  uint local_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  uint uStack_280;
  uint uStack_27c;
  uint uStack_278;
  uint uStack_274;
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined4 uStack_c4;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  uVar63 = (ulong)(byte)prim[1];
  lVar61 = uVar63 * 0x25;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 4 + 6)));
  auVar75 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 5 + 6)));
  auVar71 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 6 + 6)));
  auVar72 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0xf + 6)));
  auVar73 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar74 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x11 + 6)));
  auVar76 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1a + 6)));
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1b + 6)));
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar63 * 0x1c + 6)));
  uVar132 = *(undefined4 *)(prim + lVar61 + 0x12);
  auVar183._4_4_ = uVar132;
  auVar183._0_4_ = uVar132;
  auVar183._8_4_ = uVar132;
  auVar183._12_4_ = uVar132;
  auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar66 = vsubps_avx512vl(auVar79,*(undefined1 (*) [16])(prim + lVar61 + 6));
  fVar148 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar61 + 0x16)) *
            *(float *)(prim + lVar61 + 0x1a);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar63 * 7 + 6);
  auVar18 = vpmovsxwd_avx(auVar79);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar63 * 0xb + 6);
  auVar19 = vpmovsxwd_avx(auVar84);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar63 * 9 + 6);
  auVar20 = vpmovsxwd_avx(auVar81);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar63 * 0xd + 6);
  auVar133 = vpmovsxwd_avx(auVar80);
  auVar67 = vpbroadcastd_avx512vl();
  auVar79 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar79 = vinsertps_avx512f(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar66 = vmulps_avx512vl(auVar183,auVar66);
  auVar68 = vmulps_avx512vl(auVar183,auVar79);
  auVar69 = vcvtdq2ps_avx512vl(auVar17);
  auVar70 = vcvtdq2ps_avx512vl(auVar75);
  auVar71 = vcvtdq2ps_avx512vl(auVar71);
  auVar72 = vcvtdq2ps_avx512vl(auVar72);
  auVar73 = vcvtdq2ps_avx512vl(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar76);
  auVar81 = vcvtdq2ps_avx(auVar77);
  auVar80 = vcvtdq2ps_avx(auVar78);
  uVar132 = auVar68._0_4_;
  auVar173._4_4_ = uVar132;
  auVar173._0_4_ = uVar132;
  auVar173._8_4_ = uVar132;
  auVar173._12_4_ = uVar132;
  auVar17 = vshufps_avx(auVar68,auVar68,0x55);
  auVar75 = vshufps_avx(auVar68,auVar68,0xaa);
  auVar74 = vmulps_avx512vl(auVar75,auVar71);
  auVar139._0_4_ = auVar75._0_4_ * auVar79._0_4_;
  auVar139._4_4_ = auVar75._4_4_ * auVar79._4_4_;
  auVar139._8_4_ = auVar75._8_4_ * auVar79._8_4_;
  auVar139._12_4_ = auVar75._12_4_ * auVar79._12_4_;
  auVar68._0_4_ = auVar80._0_4_ * auVar75._0_4_;
  auVar68._4_4_ = auVar80._4_4_ * auVar75._4_4_;
  auVar68._8_4_ = auVar80._8_4_ * auVar75._8_4_;
  auVar68._12_4_ = auVar80._12_4_ * auVar75._12_4_;
  auVar75 = vfmadd231ps_avx512vl(auVar74,auVar17,auVar70);
  auVar74 = vfmadd231ps_avx512vl(auVar139,auVar17,auVar73);
  auVar17 = vfmadd231ps_fma(auVar68,auVar81,auVar17);
  auVar75 = vfmadd231ps_avx512vl(auVar75,auVar173,auVar69);
  auVar74 = vfmadd231ps_avx512vl(auVar74,auVar173,auVar72);
  auVar17 = vfmadd231ps_fma(auVar17,auVar84,auVar173);
  auVar76 = vbroadcastss_avx512vl(auVar66);
  auVar77 = vshufps_avx512vl(auVar66,auVar66,0x55);
  auVar78 = vshufps_avx512vl(auVar66,auVar66,0xaa);
  auVar71 = vmulps_avx512vl(auVar78,auVar71);
  auVar79 = vmulps_avx512vl(auVar78,auVar79);
  auVar80 = vmulps_avx512vl(auVar78,auVar80);
  auVar71 = vfmadd231ps_avx512vl(auVar71,auVar77,auVar70);
  auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar73);
  auVar81 = vfmadd231ps_avx512vl(auVar80,auVar77,auVar81);
  auVar69 = vfmadd231ps_avx512vl(auVar71,auVar76,auVar69);
  auVar70 = vfmadd231ps_avx512vl(auVar79,auVar76,auVar72);
  auVar68 = vfmadd231ps_fma(auVar81,auVar76,auVar84);
  auVar181._8_4_ = 0x7fffffff;
  auVar181._0_8_ = 0x7fffffff7fffffff;
  auVar181._12_4_ = 0x7fffffff;
  auVar79 = vandps_avx(auVar181,auVar75);
  auVar178._8_4_ = 0x219392ef;
  auVar178._0_8_ = 0x219392ef219392ef;
  auVar178._12_4_ = 0x219392ef;
  uVar60 = vcmpps_avx512vl(auVar79,auVar178,1);
  bVar59 = (bool)((byte)uVar60 & 1);
  auVar66._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar75._0_4_;
  bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar75._4_4_;
  bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar75._8_4_;
  bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar75._12_4_;
  auVar79 = vandps_avx(auVar181,auVar74);
  uVar60 = vcmpps_avx512vl(auVar79,auVar178,1);
  bVar59 = (bool)((byte)uVar60 & 1);
  auVar82._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._0_4_;
  bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar82._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._4_4_;
  bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar82._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._8_4_;
  bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar82._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar74._12_4_;
  auVar79 = vandps_avx(auVar181,auVar17);
  uVar60 = vcmpps_avx512vl(auVar79,auVar178,1);
  bVar59 = (bool)((byte)uVar60 & 1);
  auVar83._0_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar17._0_4_;
  bVar59 = (bool)((byte)(uVar60 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar17._4_4_;
  bVar59 = (bool)((byte)(uVar60 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar17._8_4_;
  bVar59 = (bool)((byte)(uVar60 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar59 * 0x219392ef | (uint)!bVar59 * auVar17._12_4_;
  auVar84 = vrcp14ps_avx512vl(auVar66);
  auVar179._8_4_ = 0x3f800000;
  auVar179._0_8_ = 0x3f8000003f800000;
  auVar179._12_4_ = 0x3f800000;
  auVar79 = vfnmadd213ps_fma(auVar66,auVar84,auVar179);
  auVar80 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar82);
  auVar79 = vfnmadd213ps_fma(auVar82,auVar84,auVar179);
  auVar78 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar84 = vrcp14ps_avx512vl(auVar83);
  auVar79 = vfnmadd213ps_fma(auVar83,auVar84,auVar179);
  auVar66 = vfmadd132ps_fma(auVar79,auVar84,auVar84);
  auVar153._4_4_ = fVar148;
  auVar153._0_4_ = fVar148;
  auVar153._8_4_ = fVar148;
  auVar153._12_4_ = fVar148;
  auVar79 = vcvtdq2ps_avx(auVar18);
  auVar84 = vcvtdq2ps_avx(auVar19);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar18 = vfmadd213ps_fma(auVar84,auVar153,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar20);
  auVar84 = vcvtdq2ps_avx(auVar133);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar19 = vfmadd213ps_fma(auVar84,auVar153,auVar79);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar63 * 0x12 + 6);
  auVar79 = vpmovsxwd_avx(auVar17);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar63 * 0x16 + 6);
  auVar84 = vpmovsxwd_avx(auVar75);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar81 = vsubps_avx(auVar84,auVar79);
  auVar71._8_8_ = 0;
  auVar71._0_8_ = *(ulong *)(prim + uVar63 * 0x14 + 6);
  auVar84 = vpmovsxwd_avx(auVar71);
  auVar81 = vfmadd213ps_fma(auVar81,auVar153,auVar79);
  auVar79 = vcvtdq2ps_avx(auVar84);
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)(prim + uVar63 * 0x18 + 6);
  auVar84 = vpmovsxwd_avx(auVar72);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar17 = vfmadd213ps_fma(auVar84,auVar153,auVar79);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar63 * 0x1d + 6);
  auVar79 = vpmovsxwd_avx(auVar73);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar63 * 0x21 + 6);
  auVar84 = vpmovsxwd_avx(auVar74);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar75 = vfmadd213ps_fma(auVar84,auVar153,auVar79);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar63 * 0x1f + 6);
  auVar79 = vpmovsxwd_avx(auVar76);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar63 * 0x23 + 6);
  auVar84 = vpmovsxwd_avx(auVar77);
  auVar84 = vcvtdq2ps_avx(auVar84);
  auVar84 = vsubps_avx(auVar84,auVar79);
  auVar84 = vfmadd213ps_fma(auVar84,auVar153,auVar79);
  auVar79 = vsubps_avx(auVar18,auVar69);
  auVar154._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar154._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar154._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar154._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar19,auVar69);
  auVar144._0_4_ = auVar80._0_4_ * auVar79._0_4_;
  auVar144._4_4_ = auVar80._4_4_ * auVar79._4_4_;
  auVar144._8_4_ = auVar80._8_4_ * auVar79._8_4_;
  auVar144._12_4_ = auVar80._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar81,auVar70);
  auVar159._0_4_ = auVar78._0_4_ * auVar79._0_4_;
  auVar159._4_4_ = auVar78._4_4_ * auVar79._4_4_;
  auVar159._8_4_ = auVar78._8_4_ * auVar79._8_4_;
  auVar159._12_4_ = auVar78._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar17,auVar70);
  auVar69._0_4_ = auVar78._0_4_ * auVar79._0_4_;
  auVar69._4_4_ = auVar78._4_4_ * auVar79._4_4_;
  auVar69._8_4_ = auVar78._8_4_ * auVar79._8_4_;
  auVar69._12_4_ = auVar78._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar75,auVar68);
  auVar70._0_4_ = auVar66._0_4_ * auVar79._0_4_;
  auVar70._4_4_ = auVar66._4_4_ * auVar79._4_4_;
  auVar70._8_4_ = auVar66._8_4_ * auVar79._8_4_;
  auVar70._12_4_ = auVar66._12_4_ * auVar79._12_4_;
  auVar79 = vsubps_avx(auVar84,auVar68);
  auVar133._0_4_ = auVar66._0_4_ * auVar79._0_4_;
  auVar133._4_4_ = auVar66._4_4_ * auVar79._4_4_;
  auVar133._8_4_ = auVar66._8_4_ * auVar79._8_4_;
  auVar133._12_4_ = auVar66._12_4_ * auVar79._12_4_;
  auVar79 = vpminsd_avx(auVar154,auVar144);
  auVar84 = vpminsd_avx(auVar159,auVar69);
  auVar79 = vmaxps_avx(auVar79,auVar84);
  auVar84 = vpminsd_avx(auVar70,auVar133);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar78._4_4_ = uVar132;
  auVar78._0_4_ = uVar132;
  auVar78._8_4_ = uVar132;
  auVar78._12_4_ = uVar132;
  auVar84 = vmaxps_avx512vl(auVar84,auVar78);
  auVar79 = vmaxps_avx(auVar79,auVar84);
  auVar18._8_4_ = 0x3f7ffffa;
  auVar18._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar18._12_4_ = 0x3f7ffffa;
  local_270 = vmulps_avx512vl(auVar79,auVar18);
  auVar79 = vpmaxsd_avx(auVar154,auVar144);
  auVar84 = vpmaxsd_avx(auVar159,auVar69);
  auVar79 = vminps_avx(auVar79,auVar84);
  auVar84 = vpmaxsd_avx(auVar70,auVar133);
  uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar19._4_4_ = uVar132;
  auVar19._0_4_ = uVar132;
  auVar19._8_4_ = uVar132;
  auVar19._12_4_ = uVar132;
  auVar84 = vminps_avx512vl(auVar84,auVar19);
  auVar79 = vminps_avx(auVar79,auVar84);
  auVar20._8_4_ = 0x3f800003;
  auVar20._0_8_ = 0x3f8000033f800003;
  auVar20._12_4_ = 0x3f800003;
  auVar79 = vmulps_avx512vl(auVar79,auVar20);
  uVar138 = vcmpps_avx512vl(local_270,auVar79,2);
  uVar21 = vpcmpgtd_avx512vl(auVar67,_DAT_01f4ad30);
  uVar60 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),(uint)((byte)uVar138 & 0xf & (byte)uVar21));
  local_4d0 = pre->ray_space + k;
  local_390 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_598 = pre;
  local_4c8 = prim;
  for (; uVar60 != 0; uVar60 = (ulong)((uint)uVar60 & (uint)uVar60 + 0xf & (uint)uVar138)) {
    lVar61 = 0;
    for (uVar63 = uVar60; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000) {
      lVar61 = lVar61 + 1;
    }
    local_590 = (ulong)*(uint *)(local_4c8 + 2);
    pGVar56 = (context->scene->geometries).items[local_590].ptr;
    uVar63 = (ulong)*(uint *)(*(long *)&pGVar56->field_0x58 +
                             (ulong)*(uint *)(local_4c8 + lVar61 * 4 + 6) *
                             pGVar56[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar148 = (pGVar56->time_range).lower;
    fVar148 = pGVar56->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar148) / ((pGVar56->time_range).upper - fVar148))
    ;
    auVar79 = vroundss_avx(ZEXT416((uint)fVar148),ZEXT416((uint)fVar148),9);
    auVar79 = vminss_avx(auVar79,ZEXT416((uint)(pGVar56->fnumTimeSegments + -1.0)));
    auVar79 = vmaxss_avx(ZEXT816(0) << 0x20,auVar79);
    fVar148 = fVar148 - auVar79._0_4_;
    fVar166 = 1.0 - fVar148;
    _Var7 = pGVar56[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar54 = (long)(int)auVar79._0_4_ * 0x38;
    lVar57 = *(long *)(_Var7 + 0x10 + lVar54);
    lVar8 = *(long *)(_Var7 + 0x38 + lVar54);
    lVar9 = *(long *)(_Var7 + 0x48 + lVar54);
    auVar67._4_4_ = fVar148;
    auVar67._0_4_ = fVar148;
    auVar67._8_4_ = fVar148;
    auVar67._12_4_ = fVar148;
    pfVar3 = (float *)(lVar8 + lVar9 * uVar63);
    auVar175._0_4_ = fVar148 * *pfVar3;
    auVar175._4_4_ = fVar148 * pfVar3[1];
    auVar175._8_4_ = fVar148 * pfVar3[2];
    auVar175._12_4_ = fVar148 * pfVar3[3];
    lVar61 = uVar63 + 1;
    auVar79 = vmulps_avx512vl(auVar67,*(undefined1 (*) [16])(lVar8 + lVar9 * lVar61));
    p_Var10 = pGVar56[4].occlusionFilterN;
    auVar140._4_4_ = fVar166;
    auVar140._0_4_ = fVar166;
    auVar140._8_4_ = fVar166;
    auVar140._12_4_ = fVar166;
    local_510 = vfmadd231ps_fma(auVar175,auVar140,
                                *(undefined1 (*) [16])(*(long *)(_Var7 + lVar54) + lVar57 * uVar63))
    ;
    _local_370 = vfmadd231ps_avx512vl
                           (auVar79,auVar140,
                            *(undefined1 (*) [16])(*(long *)(_Var7 + lVar54) + lVar57 * lVar61));
    pfVar3 = (float *)(*(long *)(p_Var10 + lVar54 + 0x38) +
                      uVar63 * *(long *)(p_Var10 + lVar54 + 0x48));
    auVar177._0_4_ = fVar148 * *pfVar3;
    auVar177._4_4_ = fVar148 * pfVar3[1];
    auVar177._8_4_ = fVar148 * pfVar3[2];
    auVar177._12_4_ = fVar148 * pfVar3[3];
    pfVar3 = (float *)(*(long *)(p_Var10 + lVar54 + 0x38) +
                      *(long *)(p_Var10 + lVar54 + 0x48) * lVar61);
    auVar182._0_4_ = fVar148 * *pfVar3;
    auVar182._4_4_ = fVar148 * pfVar3[1];
    auVar182._8_4_ = fVar148 * pfVar3[2];
    auVar182._12_4_ = fVar148 * pfVar3[3];
    auVar84 = vfmadd231ps_fma(auVar177,auVar140,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var10 + lVar54) +
                               *(long *)(p_Var10 + lVar54 + 0x10) * uVar63));
    auVar81 = vfmadd231ps_fma(auVar182,auVar140,
                              *(undefined1 (*) [16])
                               (*(long *)(p_Var10 + lVar54) +
                               *(long *)(p_Var10 + lVar54 + 0x10) * lVar61));
    iVar6 = (int)pGVar56[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar79 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar79 = vinsertps_avx(auVar79,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar141._8_4_ = 0xbeaaaaab;
    auVar141._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar141._12_4_ = 0xbeaaaaab;
    local_520 = vfnmadd213ps_fma(auVar84,auVar141,local_510);
    local_530 = vfmadd213ps_avx512vl(auVar81,auVar141,_local_370);
    auVar81 = vsubps_avx(local_510,auVar79);
    uVar132 = auVar81._0_4_;
    auVar145._4_4_ = uVar132;
    auVar145._0_4_ = uVar132;
    auVar145._8_4_ = uVar132;
    auVar145._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    aVar4 = (local_4d0->vx).field_0;
    aVar5 = (local_4d0->vy).field_0;
    fVar148 = (local_4d0->vz).field_0.m128[0];
    fVar166 = *(float *)((long)&(local_4d0->vz).field_0 + 4);
    fVar169 = *(float *)((long)&(local_4d0->vz).field_0 + 8);
    fVar170 = *(float *)((long)&(local_4d0->vz).field_0 + 0xc);
    auVar168._0_4_ = fVar148 * auVar81._0_4_;
    auVar168._4_4_ = fVar166 * auVar81._4_4_;
    auVar168._8_4_ = fVar169 * auVar81._8_4_;
    auVar168._12_4_ = fVar170 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar168,(undefined1  [16])aVar5,auVar84);
    auVar80 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar145);
    auVar81 = vsubps_avx(local_520,auVar79);
    uVar132 = auVar81._0_4_;
    auVar146._4_4_ = uVar132;
    auVar146._0_4_ = uVar132;
    auVar146._8_4_ = uVar132;
    auVar146._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar171._0_4_ = fVar148 * auVar81._0_4_;
    auVar171._4_4_ = fVar166 * auVar81._4_4_;
    auVar171._8_4_ = fVar169 * auVar81._8_4_;
    auVar171._12_4_ = fVar170 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar171,(undefined1  [16])aVar5,auVar84);
    auVar17 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar146);
    auVar81 = vsubps_avx(local_530,auVar79);
    uVar132 = auVar81._0_4_;
    auVar147._4_4_ = uVar132;
    auVar147._0_4_ = uVar132;
    auVar147._8_4_ = uVar132;
    auVar147._12_4_ = uVar132;
    auVar84 = vshufps_avx(auVar81,auVar81,0x55);
    auVar81 = vshufps_avx(auVar81,auVar81,0xaa);
    auVar174._0_4_ = fVar148 * auVar81._0_4_;
    auVar174._4_4_ = fVar166 * auVar81._4_4_;
    auVar174._8_4_ = fVar169 * auVar81._8_4_;
    auVar174._12_4_ = fVar170 * auVar81._12_4_;
    auVar84 = vfmadd231ps_fma(auVar174,(undefined1  [16])aVar5,auVar84);
    auVar81 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar4,auVar147);
    auVar84 = vsubps_avx512vl(_local_370,auVar79);
    uVar132 = auVar84._0_4_;
    auVar142._4_4_ = uVar132;
    auVar142._0_4_ = uVar132;
    auVar142._8_4_ = uVar132;
    auVar142._12_4_ = uVar132;
    auVar79 = vshufps_avx(auVar84,auVar84,0x55);
    auVar84 = vshufps_avx(auVar84,auVar84,0xaa);
    auVar180._0_4_ = fVar148 * auVar84._0_4_;
    auVar180._4_4_ = fVar166 * auVar84._4_4_;
    auVar180._8_4_ = fVar169 * auVar84._8_4_;
    auVar180._12_4_ = fVar170 * auVar84._12_4_;
    auVar79 = vfmadd231ps_fma(auVar180,(undefined1  [16])aVar5,auVar79);
    auVar75 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar142);
    lVar61 = (long)iVar6 * 0x44;
    auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar61);
    uVar132 = auVar80._0_4_;
    local_440._4_4_ = uVar132;
    local_440._0_4_ = uVar132;
    local_440._8_4_ = uVar132;
    local_440._12_4_ = uVar132;
    local_440._16_4_ = uVar132;
    local_440._20_4_ = uVar132;
    local_440._24_4_ = uVar132;
    local_440._28_4_ = uVar132;
    auVar87._8_4_ = 1;
    auVar87._0_8_ = 0x100000001;
    auVar87._12_4_ = 1;
    auVar87._16_4_ = 1;
    auVar87._20_4_ = 1;
    auVar87._24_4_ = 1;
    auVar87._28_4_ = 1;
    local_3c0 = vpermps_avx2(auVar87,ZEXT1632(auVar80));
    auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x484);
    uVar132 = auVar17._0_4_;
    local_460._4_4_ = uVar132;
    local_460._0_4_ = uVar132;
    local_460._8_4_ = uVar132;
    local_460._12_4_ = uVar132;
    local_460._16_4_ = uVar132;
    local_460._20_4_ = uVar132;
    local_460._24_4_ = uVar132;
    local_460._28_4_ = uVar132;
    local_3e0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar17));
    auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x908);
    local_480 = vbroadcastss_avx512vl(auVar81);
    local_4a0 = vpermps_avx512vl(auVar87,ZEXT1632(auVar81));
    auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0xd8c);
    fVar166 = auVar75._0_4_;
    local_400._4_4_ = fVar166;
    local_400._0_4_ = fVar166;
    local_400._8_4_ = fVar166;
    local_400._12_4_ = fVar166;
    local_400._16_4_ = fVar166;
    local_400._20_4_ = fVar166;
    local_400._24_4_ = fVar166;
    local_400._28_4_ = fVar166;
    local_420 = vpermps_avx512vl(auVar87,ZEXT1632(auVar75));
    auVar87 = vmulps_avx512vl(local_400,auVar99);
    auVar88 = vmulps_avx512vl(local_420,auVar99);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar100,local_480);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar100,local_4a0);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_460);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_3e0);
    auVar89 = vfmadd231ps_avx512vl(auVar87,auVar101,local_440);
    auVar90 = vfmadd231ps_avx512vl(auVar88,auVar101,local_3c0);
    auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar61);
    auVar88 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x484);
    auVar98 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x908);
    auVar97 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0xd8c);
    auVar91 = vmulps_avx512vl(local_400,auVar97);
    auVar92 = vmulps_avx512vl(local_420,auVar97);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar98,local_480);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar98,local_4a0);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar88,local_460);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,local_3e0);
    auVar71 = vfmadd231ps_fma(auVar91,auVar87,local_440);
    auVar72 = vfmadd231ps_fma(auVar92,auVar87,local_3c0);
    auVar91 = vsubps_avx512vl(ZEXT1632(auVar71),auVar89);
    auVar92 = vsubps_avx512vl(ZEXT1632(auVar72),auVar90);
    auVar93 = vmulps_avx512vl(auVar90,auVar91);
    auVar94 = vmulps_avx512vl(auVar89,auVar92);
    auVar93 = vsubps_avx512vl(auVar93,auVar94);
    auVar79 = vshufps_avx(local_510,local_510,0xff);
    uVar138 = auVar79._0_8_;
    local_80._8_8_ = uVar138;
    local_80._0_8_ = uVar138;
    local_80._16_8_ = uVar138;
    local_80._24_8_ = uVar138;
    auVar79 = vshufps_avx(local_520,local_520,0xff);
    local_a0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx(local_530,local_530,0xff);
    local_c0 = vbroadcastsd_avx512vl(auVar79);
    auVar79 = vshufps_avx512vl(_local_370,_local_370,0xff);
    uVar138 = auVar79._0_8_;
    register0x000012c8 = uVar138;
    local_e0 = uVar138;
    register0x000012d0 = uVar138;
    register0x000012d8 = uVar138;
    auVar94 = vmulps_avx512vl(_local_e0,auVar99);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar100,local_c0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar102,local_a0);
    auVar94 = vfmadd231ps_avx512vl(auVar94,auVar101,local_80);
    auVar95 = vmulps_avx512vl(_local_e0,auVar97);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar98,local_c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar88,local_a0);
    auVar73 = vfmadd231ps_fma(auVar95,auVar87,local_80);
    auVar95 = vmulps_avx512vl(auVar92,auVar92);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,auVar91);
    auVar96 = vmaxps_avx512vl(auVar94,ZEXT1632(auVar73));
    auVar96 = vmulps_avx512vl(auVar96,auVar96);
    auVar95 = vmulps_avx512vl(auVar96,auVar95);
    auVar93 = vmulps_avx512vl(auVar93,auVar93);
    uVar138 = vcmpps_avx512vl(auVar93,auVar95,2);
    auVar79 = vblendps_avx(auVar80,local_510,8);
    auVar74 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar84 = vandps_avx512vl(auVar79,auVar74);
    auVar79 = vblendps_avx(auVar17,local_520,8);
    auVar79 = vandps_avx512vl(auVar79,auVar74);
    auVar84 = vmaxps_avx(auVar84,auVar79);
    auVar79 = vblendps_avx(auVar81,local_530,8);
    auVar76 = vandps_avx512vl(auVar79,auVar74);
    auVar79 = vblendps_avx(auVar75,_local_370,8);
    auVar79 = vandps_avx512vl(auVar79,auVar74);
    auVar79 = vmaxps_avx(auVar76,auVar79);
    auVar79 = vmaxps_avx(auVar84,auVar79);
    auVar84 = vmovshdup_avx(auVar79);
    auVar84 = vmaxss_avx(auVar84,auVar79);
    auVar79 = vshufpd_avx(auVar79,auVar79,1);
    local_540 = vcvtsi2ss_avx512f(_local_370,iVar6);
    auVar79 = vmaxss_avx(auVar79,auVar84);
    fVar148 = local_540._0_4_;
    auVar95._4_4_ = fVar148;
    auVar95._0_4_ = fVar148;
    auVar95._8_4_ = fVar148;
    auVar95._12_4_ = fVar148;
    auVar95._16_4_ = fVar148;
    auVar95._20_4_ = fVar148;
    auVar95._24_4_ = fVar148;
    auVar95._28_4_ = fVar148;
    uVar21 = vcmpps_avx512vl(auVar95,_DAT_01f7b060,0xe);
    bVar62 = (byte)uVar138 & (byte)uVar21;
    local_320 = auVar79._0_4_ * 4.7683716e-07;
    fStack_31c = 0.0;
    fStack_318 = 0.0;
    fStack_314 = 0.0;
    auVar93._8_4_ = 2;
    auVar93._0_8_ = 0x200000002;
    auVar93._12_4_ = 2;
    auVar93._16_4_ = 2;
    auVar93._20_4_ = 2;
    auVar93._24_4_ = 2;
    auVar93._28_4_ = 2;
    local_100 = vpermps_avx512vl(auVar93,ZEXT1632(auVar80));
    local_120 = vpermps_avx512vl(auVar93,ZEXT1632(auVar17));
    local_140 = vpermps_avx512vl(auVar93,ZEXT1632(auVar81));
    local_500 = vpermps_avx512vl(auVar93,ZEXT1632(auVar75));
    local_380 = vpbroadcastd_avx512vl();
    uVar167 = *(uint *)(ray + k * 4 + 0x30);
    auVar79 = auVar97._0_16_;
    if (bVar62 == 0) {
      bVar59 = false;
      auVar79 = vxorps_avx512vl(auVar79,auVar79);
      auVar187 = ZEXT1664(auVar79);
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar188 = ZEXT3264(auVar101);
      auVar186 = ZEXT3264(local_440);
      auVar190 = ZEXT3264(local_3c0);
      auVar191 = ZEXT3264(local_460);
      auVar192 = ZEXT3264(local_3e0);
      auVar193 = ZEXT3264(local_480);
      auVar189 = ZEXT3264(local_4a0);
      auVar194 = ZEXT3264(local_400);
      auVar195 = ZEXT3264(local_420);
    }
    else {
      local_4c0._0_16_ = ZEXT416(uVar167);
      auVar97 = vmulps_avx512vl(local_500,auVar97);
      auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
      auVar88 = vfmadd213ps_avx512vl(auVar88,local_120,auVar98);
      auVar93 = vfmadd213ps_avx512vl(auVar87,local_100,auVar88);
      auVar99 = vmulps_avx512vl(local_500,auVar99);
      auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar99);
      auVar88 = vfmadd213ps_avx512vl(auVar102,local_120,auVar100);
      auVar102 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x1694);
      auVar99 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x1b18);
      auVar87 = *(undefined1 (*) [32])(bezier_basis0 + lVar61 + 0x1f9c);
      auVar95 = vfmadd213ps_avx512vl(auVar101,local_100,auVar88);
      auVar101 = vmulps_avx512vl(local_400,auVar87);
      auVar88 = vmulps_avx512vl(local_420,auVar87);
      auVar87 = vmulps_avx512vl(local_500,auVar87);
      auVar84 = vfmadd231ps_fma(auVar101,auVar99,local_480);
      auVar101 = vfmadd231ps_avx512vl(auVar88,auVar99,local_4a0);
      auVar99 = vfmadd231ps_avx512vl(auVar87,local_140,auVar99);
      auVar87 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar100,local_460);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar100,local_3e0);
      auVar88 = vfmadd231ps_avx512vl(auVar99,local_120,auVar100);
      auVar186 = ZEXT3264(local_440);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,local_440);
      auVar98 = vfmadd231ps_avx512vl(auVar101,auVar102,local_3c0);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x1210);
      auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x1b18);
      auVar99 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x1f9c);
      auVar97 = vfmadd231ps_avx512vl(auVar88,local_100,auVar102);
      auVar88._4_4_ = fVar166 * auVar99._4_4_;
      auVar88._0_4_ = fVar166 * auVar99._0_4_;
      auVar88._8_4_ = fVar166 * auVar99._8_4_;
      auVar88._12_4_ = fVar166 * auVar99._12_4_;
      auVar88._16_4_ = fVar166 * auVar99._16_4_;
      auVar88._20_4_ = fVar166 * auVar99._20_4_;
      auVar88._24_4_ = fVar166 * auVar99._24_4_;
      auVar88._28_4_ = auVar102._28_4_;
      auVar102 = vmulps_avx512vl(local_420,auVar99);
      auVar99 = vmulps_avx512vl(local_500,auVar99);
      auVar84 = vfmadd231ps_fma(auVar88,auVar100,local_480);
      auVar88 = vfmadd231ps_avx512vl(auVar102,auVar100,local_4a0);
      auVar100 = vfmadd231ps_avx512vl(auVar99,local_140,auVar100);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar61 + 0x1694);
      auVar99 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar102,local_460);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_3e0);
      auVar102 = vfmadd231ps_avx512vl(auVar100,local_120,auVar102);
      auVar100 = vfmadd231ps_avx512vl(auVar99,auVar101,local_440);
      auVar99 = vfmadd231ps_avx512vl(auVar88,auVar101,local_3c0);
      auVar88 = vfmadd231ps_avx512vl(auVar102,local_100,auVar101);
      auVar184._8_4_ = 0x7fffffff;
      auVar184._0_8_ = 0x7fffffff7fffffff;
      auVar184._12_4_ = 0x7fffffff;
      auVar184._16_4_ = 0x7fffffff;
      auVar184._20_4_ = 0x7fffffff;
      auVar184._24_4_ = 0x7fffffff;
      auVar184._28_4_ = 0x7fffffff;
      auVar101 = vandps_avx(auVar87,auVar184);
      auVar102 = vandps_avx(auVar98,auVar184);
      auVar102 = vmaxps_avx(auVar101,auVar102);
      auVar101 = vandps_avx(auVar97,auVar184);
      auVar101 = vmaxps_avx(auVar102,auVar101);
      auVar176._4_4_ = local_320;
      auVar176._0_4_ = local_320;
      auVar176._8_4_ = local_320;
      auVar176._12_4_ = local_320;
      auVar176._16_4_ = local_320;
      auVar176._20_4_ = local_320;
      auVar176._24_4_ = local_320;
      auVar176._28_4_ = local_320;
      uVar63 = vcmpps_avx512vl(auVar101,auVar176,1);
      bVar59 = (bool)((byte)uVar63 & 1);
      auVar113._0_4_ = (float)((uint)bVar59 * auVar91._0_4_ | (uint)!bVar59 * auVar87._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar113._4_4_ = (float)((uint)bVar59 * auVar91._4_4_ | (uint)!bVar59 * auVar87._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar113._8_4_ = (float)((uint)bVar59 * auVar91._8_4_ | (uint)!bVar59 * auVar87._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar113._12_4_ = (float)((uint)bVar59 * auVar91._12_4_ | (uint)!bVar59 * auVar87._12_4_);
      bVar59 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar113._16_4_ = (float)((uint)bVar59 * auVar91._16_4_ | (uint)!bVar59 * auVar87._16_4_);
      bVar59 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar113._20_4_ = (float)((uint)bVar59 * auVar91._20_4_ | (uint)!bVar59 * auVar87._20_4_);
      bVar59 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar113._24_4_ = (float)((uint)bVar59 * auVar91._24_4_ | (uint)!bVar59 * auVar87._24_4_);
      bVar59 = SUB81(uVar63 >> 7,0);
      auVar113._28_4_ = (uint)bVar59 * auVar91._28_4_ | (uint)!bVar59 * auVar87._28_4_;
      bVar59 = (bool)((byte)uVar63 & 1);
      auVar103._0_4_ = (float)((uint)bVar59 * auVar92._0_4_ | (uint)!bVar59 * auVar98._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar103._4_4_ = (float)((uint)bVar59 * auVar92._4_4_ | (uint)!bVar59 * auVar98._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar103._8_4_ = (float)((uint)bVar59 * auVar92._8_4_ | (uint)!bVar59 * auVar98._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar103._12_4_ = (float)((uint)bVar59 * auVar92._12_4_ | (uint)!bVar59 * auVar98._12_4_);
      bVar59 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar103._16_4_ = (float)((uint)bVar59 * auVar92._16_4_ | (uint)!bVar59 * auVar98._16_4_);
      bVar59 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar103._20_4_ = (float)((uint)bVar59 * auVar92._20_4_ | (uint)!bVar59 * auVar98._20_4_);
      bVar59 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar103._24_4_ = (float)((uint)bVar59 * auVar92._24_4_ | (uint)!bVar59 * auVar98._24_4_);
      bVar59 = SUB81(uVar63 >> 7,0);
      auVar103._28_4_ = (uint)bVar59 * auVar92._28_4_ | (uint)!bVar59 * auVar98._28_4_;
      auVar101 = vandps_avx(auVar184,auVar100);
      auVar102 = vandps_avx(auVar99,auVar184);
      auVar102 = vmaxps_avx(auVar101,auVar102);
      auVar101 = vandps_avx(auVar88,auVar184);
      auVar101 = vmaxps_avx(auVar102,auVar101);
      uVar63 = vcmpps_avx512vl(auVar101,auVar176,1);
      bVar59 = (bool)((byte)uVar63 & 1);
      auVar104._0_4_ = (float)((uint)bVar59 * auVar91._0_4_ | (uint)!bVar59 * auVar100._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar104._4_4_ = (float)((uint)bVar59 * auVar91._4_4_ | (uint)!bVar59 * auVar100._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar104._8_4_ = (float)((uint)bVar59 * auVar91._8_4_ | (uint)!bVar59 * auVar100._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar104._12_4_ = (float)((uint)bVar59 * auVar91._12_4_ | (uint)!bVar59 * auVar100._12_4_);
      bVar59 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar104._16_4_ = (float)((uint)bVar59 * auVar91._16_4_ | (uint)!bVar59 * auVar100._16_4_);
      bVar59 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar104._20_4_ = (float)((uint)bVar59 * auVar91._20_4_ | (uint)!bVar59 * auVar100._20_4_);
      bVar59 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar104._24_4_ = (float)((uint)bVar59 * auVar91._24_4_ | (uint)!bVar59 * auVar100._24_4_);
      bVar59 = SUB81(uVar63 >> 7,0);
      auVar104._28_4_ = (uint)bVar59 * auVar91._28_4_ | (uint)!bVar59 * auVar100._28_4_;
      bVar59 = (bool)((byte)uVar63 & 1);
      auVar105._0_4_ = (float)((uint)bVar59 * auVar92._0_4_ | (uint)!bVar59 * auVar99._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar105._4_4_ = (float)((uint)bVar59 * auVar92._4_4_ | (uint)!bVar59 * auVar99._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar105._8_4_ = (float)((uint)bVar59 * auVar92._8_4_ | (uint)!bVar59 * auVar99._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar105._12_4_ = (float)((uint)bVar59 * auVar92._12_4_ | (uint)!bVar59 * auVar99._12_4_);
      bVar59 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar105._16_4_ = (float)((uint)bVar59 * auVar92._16_4_ | (uint)!bVar59 * auVar99._16_4_);
      bVar59 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar105._20_4_ = (float)((uint)bVar59 * auVar92._20_4_ | (uint)!bVar59 * auVar99._20_4_);
      bVar59 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar105._24_4_ = (float)((uint)bVar59 * auVar92._24_4_ | (uint)!bVar59 * auVar99._24_4_);
      bVar59 = SUB81(uVar63 >> 7,0);
      auVar105._28_4_ = (uint)bVar59 * auVar92._28_4_ | (uint)!bVar59 * auVar99._28_4_;
      auVar78 = vxorps_avx512vl(auVar79,auVar79);
      auVar187 = ZEXT1664(auVar78);
      auVar101 = vfmadd213ps_avx512vl(auVar113,auVar113,ZEXT1632(auVar78));
      auVar79 = vfmadd231ps_fma(auVar101,auVar103,auVar103);
      auVar100 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
      fVar166 = auVar100._0_4_;
      fVar169 = auVar100._4_4_;
      fVar170 = auVar100._8_4_;
      fVar163 = auVar100._12_4_;
      fVar162 = auVar100._16_4_;
      fVar164 = auVar100._20_4_;
      fVar64 = auVar100._24_4_;
      auVar101._4_4_ = fVar169 * fVar169 * fVar169 * auVar79._4_4_ * -0.5;
      auVar101._0_4_ = fVar166 * fVar166 * fVar166 * auVar79._0_4_ * -0.5;
      auVar101._8_4_ = fVar170 * fVar170 * fVar170 * auVar79._8_4_ * -0.5;
      auVar101._12_4_ = fVar163 * fVar163 * fVar163 * auVar79._12_4_ * -0.5;
      auVar101._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar101._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar101._24_4_ = fVar64 * fVar64 * fVar64 * -0.0;
      auVar101._28_4_ = 0;
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar87,auVar100);
      auVar102._4_4_ = auVar103._4_4_ * auVar101._4_4_;
      auVar102._0_4_ = auVar103._0_4_ * auVar101._0_4_;
      auVar102._8_4_ = auVar103._8_4_ * auVar101._8_4_;
      auVar102._12_4_ = auVar103._12_4_ * auVar101._12_4_;
      auVar102._16_4_ = auVar103._16_4_ * auVar101._16_4_;
      auVar102._20_4_ = auVar103._20_4_ * auVar101._20_4_;
      auVar102._24_4_ = auVar103._24_4_ * auVar101._24_4_;
      auVar102._28_4_ = auVar100._28_4_;
      auVar100._4_4_ = auVar101._4_4_ * -auVar113._4_4_;
      auVar100._0_4_ = auVar101._0_4_ * -auVar113._0_4_;
      auVar100._8_4_ = auVar101._8_4_ * -auVar113._8_4_;
      auVar100._12_4_ = auVar101._12_4_ * -auVar113._12_4_;
      auVar100._16_4_ = auVar101._16_4_ * -auVar113._16_4_;
      auVar100._20_4_ = auVar101._20_4_ * -auVar113._20_4_;
      auVar100._24_4_ = auVar101._24_4_ * -auVar113._24_4_;
      auVar100._28_4_ = auVar113._28_4_ ^ 0x80000000;
      auVar88 = vmulps_avx512vl(auVar101,ZEXT1632(auVar78));
      auVar91 = ZEXT1632(auVar78);
      auVar99 = vfmadd213ps_avx512vl(auVar104,auVar104,auVar91);
      auVar79 = vfmadd231ps_fma(auVar99,auVar105,auVar105);
      auVar97 = vrsqrt14ps_avx512vl(ZEXT1632(auVar79));
      fVar166 = auVar97._0_4_;
      fVar169 = auVar97._4_4_;
      fVar170 = auVar97._8_4_;
      fVar163 = auVar97._12_4_;
      fVar162 = auVar97._16_4_;
      fVar164 = auVar97._20_4_;
      fVar64 = auVar97._24_4_;
      auVar99._4_4_ = fVar169 * fVar169 * fVar169 * auVar79._4_4_ * -0.5;
      auVar99._0_4_ = fVar166 * fVar166 * fVar166 * auVar79._0_4_ * -0.5;
      auVar99._8_4_ = fVar170 * fVar170 * fVar170 * auVar79._8_4_ * -0.5;
      auVar99._12_4_ = fVar163 * fVar163 * fVar163 * auVar79._12_4_ * -0.5;
      auVar99._16_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar99._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar99._24_4_ = fVar64 * fVar64 * fVar64 * -0.0;
      auVar99._28_4_ = 0;
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar87,auVar97);
      auVar98._4_4_ = auVar105._4_4_ * auVar99._4_4_;
      auVar98._0_4_ = auVar105._0_4_ * auVar99._0_4_;
      auVar98._8_4_ = auVar105._8_4_ * auVar99._8_4_;
      auVar98._12_4_ = auVar105._12_4_ * auVar99._12_4_;
      auVar98._16_4_ = auVar105._16_4_ * auVar99._16_4_;
      auVar98._20_4_ = auVar105._20_4_ * auVar99._20_4_;
      auVar98._24_4_ = auVar105._24_4_ * auVar99._24_4_;
      auVar98._28_4_ = auVar97._28_4_;
      auVar97._4_4_ = -auVar104._4_4_ * auVar99._4_4_;
      auVar97._0_4_ = -auVar104._0_4_ * auVar99._0_4_;
      auVar97._8_4_ = -auVar104._8_4_ * auVar99._8_4_;
      auVar97._12_4_ = -auVar104._12_4_ * auVar99._12_4_;
      auVar97._16_4_ = -auVar104._16_4_ * auVar99._16_4_;
      auVar97._20_4_ = -auVar104._20_4_ * auVar99._20_4_;
      auVar97._24_4_ = -auVar104._24_4_ * auVar99._24_4_;
      auVar97._28_4_ = auVar101._28_4_;
      auVar101 = vmulps_avx512vl(auVar99,auVar91);
      auVar79 = vfmadd213ps_fma(auVar102,auVar94,auVar89);
      auVar84 = vfmadd213ps_fma(auVar100,auVar94,auVar90);
      auVar99 = vfmadd213ps_avx512vl(auVar88,auVar94,auVar95);
      auVar87 = vfmadd213ps_avx512vl(auVar98,ZEXT1632(auVar73),ZEXT1632(auVar71));
      auVar74 = vfnmadd213ps_fma(auVar102,auVar94,auVar89);
      auVar89 = ZEXT1632(auVar73);
      auVar81 = vfmadd213ps_fma(auVar97,auVar89,ZEXT1632(auVar72));
      auVar76 = vfnmadd213ps_fma(auVar100,auVar94,auVar90);
      auVar80 = vfmadd213ps_fma(auVar101,auVar89,auVar93);
      auVar102 = vfnmadd231ps_avx512vl(auVar95,auVar94,auVar88);
      auVar71 = vfnmadd213ps_fma(auVar98,auVar89,ZEXT1632(auVar71));
      auVar72 = vfnmadd213ps_fma(auVar97,auVar89,ZEXT1632(auVar72));
      auVar77 = vfnmadd231ps_fma(auVar93,ZEXT1632(auVar73),auVar101);
      auVar100 = vsubps_avx512vl(auVar87,ZEXT1632(auVar74));
      auVar101 = vsubps_avx(ZEXT1632(auVar81),ZEXT1632(auVar76));
      auVar88 = vsubps_avx512vl(ZEXT1632(auVar80),auVar102);
      auVar98 = vmulps_avx512vl(auVar101,auVar102);
      auVar17 = vfmsub231ps_fma(auVar98,ZEXT1632(auVar76),auVar88);
      auVar89._4_4_ = auVar74._4_4_ * auVar88._4_4_;
      auVar89._0_4_ = auVar74._0_4_ * auVar88._0_4_;
      auVar89._8_4_ = auVar74._8_4_ * auVar88._8_4_;
      auVar89._12_4_ = auVar74._12_4_ * auVar88._12_4_;
      auVar89._16_4_ = auVar88._16_4_ * 0.0;
      auVar89._20_4_ = auVar88._20_4_ * 0.0;
      auVar89._24_4_ = auVar88._24_4_ * 0.0;
      auVar89._28_4_ = auVar88._28_4_;
      auVar88 = vfmsub231ps_avx512vl(auVar89,auVar102,auVar100);
      auVar90._4_4_ = auVar76._4_4_ * auVar100._4_4_;
      auVar90._0_4_ = auVar76._0_4_ * auVar100._0_4_;
      auVar90._8_4_ = auVar76._8_4_ * auVar100._8_4_;
      auVar90._12_4_ = auVar76._12_4_ * auVar100._12_4_;
      auVar90._16_4_ = auVar100._16_4_ * 0.0;
      auVar90._20_4_ = auVar100._20_4_ * 0.0;
      auVar90._24_4_ = auVar100._24_4_ * 0.0;
      auVar90._28_4_ = auVar100._28_4_;
      auVar75 = vfmsub231ps_fma(auVar90,ZEXT1632(auVar74),auVar101);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),auVar91,auVar88);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,ZEXT1632(auVar17));
      auVar93 = ZEXT1632(auVar78);
      uVar63 = vcmpps_avx512vl(auVar101,auVar93,2);
      bVar53 = (byte)uVar63;
      fVar64 = (float)((uint)(bVar53 & 1) * auVar79._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar71._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      fVar124 = (float)((uint)bVar59 * auVar79._4_4_ | (uint)!bVar59 * auVar71._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      fVar126 = (float)((uint)bVar59 * auVar79._8_4_ | (uint)!bVar59 * auVar71._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      fVar128 = (float)((uint)bVar59 * auVar79._12_4_ | (uint)!bVar59 * auVar71._12_4_);
      auVar98 = ZEXT1632(CONCAT412(fVar128,CONCAT48(fVar126,CONCAT44(fVar124,fVar64))));
      fVar65 = (float)((uint)(bVar53 & 1) * auVar84._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar72._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      fVar125 = (float)((uint)bVar59 * auVar84._4_4_ | (uint)!bVar59 * auVar72._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      fVar127 = (float)((uint)bVar59 * auVar84._8_4_ | (uint)!bVar59 * auVar72._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      fVar129 = (float)((uint)bVar59 * auVar84._12_4_ | (uint)!bVar59 * auVar72._12_4_);
      auVar97 = ZEXT1632(CONCAT412(fVar129,CONCAT48(fVar127,CONCAT44(fVar125,fVar65))));
      auVar106._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar77._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar106._4_4_ = (float)((uint)bVar59 * auVar99._4_4_ | (uint)!bVar59 * auVar77._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar106._8_4_ = (float)((uint)bVar59 * auVar99._8_4_ | (uint)!bVar59 * auVar77._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar106._12_4_ = (float)((uint)bVar59 * auVar99._12_4_ | (uint)!bVar59 * auVar77._12_4_);
      fVar169 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar99._16_4_);
      auVar106._16_4_ = fVar169;
      fVar166 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar99._20_4_);
      auVar106._20_4_ = fVar166;
      fVar170 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar99._24_4_);
      auVar106._24_4_ = fVar170;
      iVar1 = (uint)(byte)(uVar63 >> 7) * auVar99._28_4_;
      auVar106._28_4_ = iVar1;
      auVar100 = vblendmps_avx512vl(ZEXT1632(auVar74),auVar87);
      auVar107._0_4_ =
           (uint)(bVar53 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar84._0_4_;
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar107._4_4_ = (uint)bVar59 * auVar100._4_4_ | (uint)!bVar59 * auVar84._4_4_;
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar107._8_4_ = (uint)bVar59 * auVar100._8_4_ | (uint)!bVar59 * auVar84._8_4_;
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar107._12_4_ = (uint)bVar59 * auVar100._12_4_ | (uint)!bVar59 * auVar84._12_4_;
      auVar107._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_;
      auVar107._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_;
      auVar107._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_;
      auVar107._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
      auVar100 = vblendmps_avx512vl(ZEXT1632(auVar76),ZEXT1632(auVar81));
      auVar108._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar17._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar108._4_4_ = (float)((uint)bVar59 * auVar100._4_4_ | (uint)!bVar59 * auVar17._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar108._8_4_ = (float)((uint)bVar59 * auVar100._8_4_ | (uint)!bVar59 * auVar17._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar108._12_4_ = (float)((uint)bVar59 * auVar100._12_4_ | (uint)!bVar59 * auVar17._12_4_);
      fVar163 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_);
      auVar108._16_4_ = fVar163;
      fVar162 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_);
      auVar108._20_4_ = fVar162;
      fVar164 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_);
      auVar108._24_4_ = fVar164;
      auVar108._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
      auVar100 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar80));
      auVar109._0_4_ =
           (float)((uint)(bVar53 & 1) * auVar100._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar99._0_4_);
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar109._4_4_ = (float)((uint)bVar59 * auVar100._4_4_ | (uint)!bVar59 * auVar99._4_4_);
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar109._8_4_ = (float)((uint)bVar59 * auVar100._8_4_ | (uint)!bVar59 * auVar99._8_4_);
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar109._12_4_ = (float)((uint)bVar59 * auVar100._12_4_ | (uint)!bVar59 * auVar99._12_4_);
      bVar59 = (bool)((byte)(uVar63 >> 4) & 1);
      auVar109._16_4_ = (float)((uint)bVar59 * auVar100._16_4_ | (uint)!bVar59 * auVar99._16_4_);
      bVar59 = (bool)((byte)(uVar63 >> 5) & 1);
      auVar109._20_4_ = (float)((uint)bVar59 * auVar100._20_4_ | (uint)!bVar59 * auVar99._20_4_);
      bVar59 = (bool)((byte)(uVar63 >> 6) & 1);
      auVar109._24_4_ = (float)((uint)bVar59 * auVar100._24_4_ | (uint)!bVar59 * auVar99._24_4_);
      bVar59 = SUB81(uVar63 >> 7,0);
      auVar109._28_4_ = (uint)bVar59 * auVar100._28_4_ | (uint)!bVar59 * auVar99._28_4_;
      auVar110._0_4_ =
           (uint)(bVar53 & 1) * (int)auVar74._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar87._0_4_;
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar110._4_4_ = (uint)bVar59 * (int)auVar74._4_4_ | (uint)!bVar59 * auVar87._4_4_;
      bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar110._8_4_ = (uint)bVar59 * (int)auVar74._8_4_ | (uint)!bVar59 * auVar87._8_4_;
      bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar110._12_4_ = (uint)bVar59 * (int)auVar74._12_4_ | (uint)!bVar59 * auVar87._12_4_;
      auVar110._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar87._16_4_;
      auVar110._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar87._20_4_;
      auVar110._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar87._24_4_;
      auVar110._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar87._28_4_;
      bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
      bVar12 = (bool)((byte)(uVar63 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar111._0_4_ =
           (uint)(bVar53 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar80._0_4_;
      bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
      auVar111._4_4_ = (uint)bVar11 * auVar102._4_4_ | (uint)!bVar11 * auVar80._4_4_;
      bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
      auVar111._8_4_ = (uint)bVar11 * auVar102._8_4_ | (uint)!bVar11 * auVar80._8_4_;
      bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
      auVar111._12_4_ = (uint)bVar11 * auVar102._12_4_ | (uint)!bVar11 * auVar80._12_4_;
      auVar111._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar102._16_4_;
      auVar111._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar102._20_4_;
      auVar111._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar102._24_4_;
      iVar2 = (uint)(byte)(uVar63 >> 7) * auVar102._28_4_;
      auVar111._28_4_ = iVar2;
      auVar89 = vsubps_avx512vl(auVar110,auVar98);
      auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar14 * (int)auVar76._12_4_ |
                                               (uint)!bVar14 * auVar81._12_4_,
                                               CONCAT48((uint)bVar12 * (int)auVar76._8_4_ |
                                                        (uint)!bVar12 * auVar81._8_4_,
                                                        CONCAT44((uint)bVar59 * (int)auVar76._4_4_ |
                                                                 (uint)!bVar59 * auVar81._4_4_,
                                                                 (uint)(bVar53 & 1) *
                                                                 (int)auVar76._0_4_ |
                                                                 (uint)!(bool)(bVar53 & 1) *
                                                                 auVar81._0_4_)))),auVar97);
      auVar100 = vsubps_avx(auVar111,auVar106);
      auVar99 = vsubps_avx(auVar98,auVar107);
      auVar87 = vsubps_avx(auVar97,auVar108);
      auVar88 = vsubps_avx(auVar106,auVar109);
      auVar91._4_4_ = auVar100._4_4_ * fVar124;
      auVar91._0_4_ = auVar100._0_4_ * fVar64;
      auVar91._8_4_ = auVar100._8_4_ * fVar126;
      auVar91._12_4_ = auVar100._12_4_ * fVar128;
      auVar91._16_4_ = auVar100._16_4_ * 0.0;
      auVar91._20_4_ = auVar100._20_4_ * 0.0;
      auVar91._24_4_ = auVar100._24_4_ * 0.0;
      auVar91._28_4_ = iVar2;
      auVar79 = vfmsub231ps_fma(auVar91,auVar106,auVar89);
      auVar92._4_4_ = fVar125 * auVar89._4_4_;
      auVar92._0_4_ = fVar65 * auVar89._0_4_;
      auVar92._8_4_ = fVar127 * auVar89._8_4_;
      auVar92._12_4_ = fVar129 * auVar89._12_4_;
      auVar92._16_4_ = auVar89._16_4_ * 0.0;
      auVar92._20_4_ = auVar89._20_4_ * 0.0;
      auVar92._24_4_ = auVar89._24_4_ * 0.0;
      auVar92._28_4_ = auVar101._28_4_;
      auVar84 = vfmsub231ps_fma(auVar92,auVar98,auVar102);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar93,ZEXT1632(auVar79));
      auVar155._0_4_ = auVar102._0_4_ * auVar106._0_4_;
      auVar155._4_4_ = auVar102._4_4_ * auVar106._4_4_;
      auVar155._8_4_ = auVar102._8_4_ * auVar106._8_4_;
      auVar155._12_4_ = auVar102._12_4_ * auVar106._12_4_;
      auVar155._16_4_ = auVar102._16_4_ * fVar169;
      auVar155._20_4_ = auVar102._20_4_ * fVar166;
      auVar155._24_4_ = auVar102._24_4_ * fVar170;
      auVar155._28_4_ = 0;
      auVar79 = vfmsub231ps_fma(auVar155,auVar97,auVar100);
      auVar90 = vfmadd231ps_avx512vl(auVar101,auVar93,ZEXT1632(auVar79));
      auVar101 = vmulps_avx512vl(auVar88,auVar107);
      auVar101 = vfmsub231ps_avx512vl(auVar101,auVar99,auVar109);
      auVar96._4_4_ = auVar87._4_4_ * auVar109._4_4_;
      auVar96._0_4_ = auVar87._0_4_ * auVar109._0_4_;
      auVar96._8_4_ = auVar87._8_4_ * auVar109._8_4_;
      auVar96._12_4_ = auVar87._12_4_ * auVar109._12_4_;
      auVar96._16_4_ = auVar87._16_4_ * auVar109._16_4_;
      auVar96._20_4_ = auVar87._20_4_ * auVar109._20_4_;
      auVar96._24_4_ = auVar87._24_4_ * auVar109._24_4_;
      auVar96._28_4_ = auVar109._28_4_;
      auVar79 = vfmsub231ps_fma(auVar96,auVar108,auVar88);
      auVar156._0_4_ = auVar108._0_4_ * auVar99._0_4_;
      auVar156._4_4_ = auVar108._4_4_ * auVar99._4_4_;
      auVar156._8_4_ = auVar108._8_4_ * auVar99._8_4_;
      auVar156._12_4_ = auVar108._12_4_ * auVar99._12_4_;
      auVar156._16_4_ = fVar163 * auVar99._16_4_;
      auVar156._20_4_ = fVar162 * auVar99._20_4_;
      auVar156._24_4_ = fVar164 * auVar99._24_4_;
      auVar156._28_4_ = 0;
      auVar84 = vfmsub231ps_fma(auVar156,auVar87,auVar107);
      auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar93,auVar101);
      auVar91 = vfmadd231ps_avx512vl(auVar101,auVar93,ZEXT1632(auVar79));
      auVar101 = vmaxps_avx(auVar90,auVar91);
      uVar138 = vcmpps_avx512vl(auVar101,auVar93,2);
      bVar62 = bVar62 & (byte)uVar138;
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar188 = ZEXT3264(auVar92);
      auVar190 = ZEXT3264(local_3c0);
      auVar191 = ZEXT3264(local_460);
      auVar192 = ZEXT3264(local_3e0);
      auVar193 = ZEXT3264(local_480);
      auVar189 = ZEXT3264(local_4a0);
      auVar194 = ZEXT3264(local_400);
      auVar195 = ZEXT3264(local_420);
      if (bVar62 == 0) {
        bVar59 = false;
      }
      else {
        auVar28._4_4_ = auVar88._4_4_ * auVar102._4_4_;
        auVar28._0_4_ = auVar88._0_4_ * auVar102._0_4_;
        auVar28._8_4_ = auVar88._8_4_ * auVar102._8_4_;
        auVar28._12_4_ = auVar88._12_4_ * auVar102._12_4_;
        auVar28._16_4_ = auVar88._16_4_ * auVar102._16_4_;
        auVar28._20_4_ = auVar88._20_4_ * auVar102._20_4_;
        auVar28._24_4_ = auVar88._24_4_ * auVar102._24_4_;
        auVar28._28_4_ = auVar101._28_4_;
        auVar81 = vfmsub231ps_fma(auVar28,auVar87,auVar100);
        auVar29._4_4_ = auVar100._4_4_ * auVar99._4_4_;
        auVar29._0_4_ = auVar100._0_4_ * auVar99._0_4_;
        auVar29._8_4_ = auVar100._8_4_ * auVar99._8_4_;
        auVar29._12_4_ = auVar100._12_4_ * auVar99._12_4_;
        auVar29._16_4_ = auVar100._16_4_ * auVar99._16_4_;
        auVar29._20_4_ = auVar100._20_4_ * auVar99._20_4_;
        auVar29._24_4_ = auVar100._24_4_ * auVar99._24_4_;
        auVar29._28_4_ = auVar100._28_4_;
        auVar84 = vfmsub231ps_fma(auVar29,auVar89,auVar88);
        auVar30._4_4_ = auVar87._4_4_ * auVar89._4_4_;
        auVar30._0_4_ = auVar87._0_4_ * auVar89._0_4_;
        auVar30._8_4_ = auVar87._8_4_ * auVar89._8_4_;
        auVar30._12_4_ = auVar87._12_4_ * auVar89._12_4_;
        auVar30._16_4_ = auVar87._16_4_ * auVar89._16_4_;
        auVar30._20_4_ = auVar87._20_4_ * auVar89._20_4_;
        auVar30._24_4_ = auVar87._24_4_ * auVar89._24_4_;
        auVar30._28_4_ = auVar87._28_4_;
        auVar80 = vfmsub231ps_fma(auVar30,auVar99,auVar102);
        auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar80));
        auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar81),auVar93);
        auVar102 = vrcp14ps_avx512vl(auVar101);
        auVar100 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar92);
        auVar79 = vfmadd132ps_fma(auVar100,auVar102,auVar102);
        auVar31._4_4_ = auVar80._4_4_ * auVar106._4_4_;
        auVar31._0_4_ = auVar80._0_4_ * auVar106._0_4_;
        auVar31._8_4_ = auVar80._8_4_ * auVar106._8_4_;
        auVar31._12_4_ = auVar80._12_4_ * auVar106._12_4_;
        auVar31._16_4_ = fVar169 * 0.0;
        auVar31._20_4_ = fVar166 * 0.0;
        auVar31._24_4_ = fVar170 * 0.0;
        auVar31._28_4_ = iVar1;
        auVar84 = vfmadd231ps_fma(auVar31,auVar97,ZEXT1632(auVar84));
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar98,ZEXT1632(auVar81));
        fVar166 = auVar79._0_4_;
        fVar169 = auVar79._4_4_;
        fVar170 = auVar79._8_4_;
        fVar163 = auVar79._12_4_;
        local_220 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar163,
                                       CONCAT48(auVar84._8_4_ * fVar170,
                                                CONCAT44(auVar84._4_4_ * fVar169,
                                                         auVar84._0_4_ * fVar166))));
        auVar165._4_4_ = uVar167;
        auVar165._0_4_ = uVar167;
        auVar165._8_4_ = uVar167;
        auVar165._12_4_ = uVar167;
        auVar165._16_4_ = uVar167;
        auVar165._20_4_ = uVar167;
        auVar165._24_4_ = uVar167;
        auVar165._28_4_ = uVar167;
        uVar138 = vcmpps_avx512vl(auVar165,local_220,2);
        uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar23._4_4_ = uVar132;
        auVar23._0_4_ = uVar132;
        auVar23._8_4_ = uVar132;
        auVar23._12_4_ = uVar132;
        auVar23._16_4_ = uVar132;
        auVar23._20_4_ = uVar132;
        auVar23._24_4_ = uVar132;
        auVar23._28_4_ = uVar132;
        uVar21 = vcmpps_avx512vl(local_220,auVar23,2);
        bVar62 = (byte)uVar138 & (byte)uVar21 & bVar62;
        if (bVar62 != 0) {
          uVar138 = vcmpps_avx512vl(auVar101,auVar93,4);
          bVar62 = bVar62 & (byte)uVar138;
          if (bVar62 != 0) {
            fVar162 = auVar90._0_4_ * fVar166;
            fVar164 = auVar90._4_4_ * fVar169;
            auVar32._4_4_ = fVar164;
            auVar32._0_4_ = fVar162;
            fVar64 = auVar90._8_4_ * fVar170;
            auVar32._8_4_ = fVar64;
            fVar65 = auVar90._12_4_ * fVar163;
            auVar32._12_4_ = fVar65;
            fVar124 = auVar90._16_4_ * 0.0;
            auVar32._16_4_ = fVar124;
            fVar125 = auVar90._20_4_ * 0.0;
            auVar32._20_4_ = fVar125;
            fVar126 = auVar90._24_4_ * 0.0;
            auVar32._24_4_ = fVar126;
            auVar32._28_4_ = auVar101._28_4_;
            auVar102 = vsubps_avx512vl(auVar92,auVar32);
            local_260._0_4_ =
                 (float)((uint)(bVar53 & 1) * (int)fVar162 |
                        (uint)!(bool)(bVar53 & 1) * auVar102._0_4_);
            bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
            local_260._4_4_ = (float)((uint)bVar59 * (int)fVar164 | (uint)!bVar59 * auVar102._4_4_);
            bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
            local_260._8_4_ = (float)((uint)bVar59 * (int)fVar64 | (uint)!bVar59 * auVar102._8_4_);
            bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
            local_260._12_4_ = (float)((uint)bVar59 * (int)fVar65 | (uint)!bVar59 * auVar102._12_4_)
            ;
            bVar59 = (bool)((byte)(uVar63 >> 4) & 1);
            local_260._16_4_ =
                 (float)((uint)bVar59 * (int)fVar124 | (uint)!bVar59 * auVar102._16_4_);
            bVar59 = (bool)((byte)(uVar63 >> 5) & 1);
            local_260._20_4_ =
                 (float)((uint)bVar59 * (int)fVar125 | (uint)!bVar59 * auVar102._20_4_);
            bVar59 = (bool)((byte)(uVar63 >> 6) & 1);
            local_260._24_4_ =
                 (float)((uint)bVar59 * (int)fVar126 | (uint)!bVar59 * auVar102._24_4_);
            bVar59 = SUB81(uVar63 >> 7,0);
            local_260._28_4_ =
                 (float)((uint)bVar59 * auVar101._28_4_ | (uint)!bVar59 * auVar102._28_4_);
            auVar101 = vsubps_avx(ZEXT1632(auVar73),auVar94);
            auVar79 = vfmadd213ps_fma(auVar101,local_260,auVar94);
            uVar132 = *(undefined4 *)((long)local_598->ray_space + k * 4 + -0x10);
            auVar94._4_4_ = uVar132;
            auVar94._0_4_ = uVar132;
            auVar94._8_4_ = uVar132;
            auVar94._12_4_ = uVar132;
            auVar94._16_4_ = uVar132;
            auVar94._20_4_ = uVar132;
            auVar94._24_4_ = uVar132;
            auVar94._28_4_ = uVar132;
            auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                          CONCAT48(auVar79._8_4_ + auVar79._8_4_,
                                                                   CONCAT44(auVar79._4_4_ +
                                                                            auVar79._4_4_,
                                                                            auVar79._0_4_ +
                                                                            auVar79._0_4_)))),
                                       auVar94);
            uVar138 = vcmpps_avx512vl(local_220,auVar101,6);
            if (((byte)uVar138 & bVar62) != 0) {
              auVar151._0_4_ = auVar91._0_4_ * fVar166;
              auVar151._4_4_ = auVar91._4_4_ * fVar169;
              auVar151._8_4_ = auVar91._8_4_ * fVar170;
              auVar151._12_4_ = auVar91._12_4_ * fVar163;
              auVar151._16_4_ = auVar91._16_4_ * 0.0;
              auVar151._20_4_ = auVar91._20_4_ * 0.0;
              auVar151._24_4_ = auVar91._24_4_ * 0.0;
              auVar151._28_4_ = 0;
              auVar101 = vsubps_avx512vl(auVar92,auVar151);
              auVar112._0_4_ =
                   (uint)(bVar53 & 1) * (int)auVar151._0_4_ |
                   (uint)!(bool)(bVar53 & 1) * auVar101._0_4_;
              bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
              auVar112._4_4_ = (uint)bVar59 * (int)auVar151._4_4_ | (uint)!bVar59 * auVar101._4_4_;
              bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
              auVar112._8_4_ = (uint)bVar59 * (int)auVar151._8_4_ | (uint)!bVar59 * auVar101._8_4_;
              bVar59 = (bool)((byte)(uVar63 >> 3) & 1);
              auVar112._12_4_ =
                   (uint)bVar59 * (int)auVar151._12_4_ | (uint)!bVar59 * auVar101._12_4_;
              bVar59 = (bool)((byte)(uVar63 >> 4) & 1);
              auVar112._16_4_ =
                   (uint)bVar59 * (int)auVar151._16_4_ | (uint)!bVar59 * auVar101._16_4_;
              bVar59 = (bool)((byte)(uVar63 >> 5) & 1);
              auVar112._20_4_ =
                   (uint)bVar59 * (int)auVar151._20_4_ | (uint)!bVar59 * auVar101._20_4_;
              bVar59 = (bool)((byte)(uVar63 >> 6) & 1);
              auVar112._24_4_ =
                   (uint)bVar59 * (int)auVar151._24_4_ | (uint)!bVar59 * auVar101._24_4_;
              auVar112._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar101._28_4_;
              auVar24._8_4_ = 0x40000000;
              auVar24._0_8_ = 0x4000000040000000;
              auVar24._12_4_ = 0x40000000;
              auVar24._16_4_ = 0x40000000;
              auVar24._20_4_ = 0x40000000;
              auVar24._24_4_ = 0x40000000;
              auVar24._28_4_ = 0x40000000;
              local_240 = vfmsub132ps_avx512vl(auVar112,auVar92,auVar24);
              local_200 = 0;
              local_1f0 = local_510._0_8_;
              uStack_1e8 = local_510._8_8_;
              local_1e0 = local_520._0_8_;
              uStack_1d8 = local_520._8_8_;
              local_1d0 = local_530._0_8_;
              uStack_1c8 = local_530._8_8_;
              if ((pGVar56->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (bVar59 = true, pGVar56->occlusionFilterN == (RTCFilterFunctionN)0x0))
                goto LAB_0191fbe0;
                fVar148 = 1.0 / fVar148;
                local_1a0[0] = fVar148 * (local_260._0_4_ + 0.0);
                local_1a0[1] = fVar148 * (local_260._4_4_ + 1.0);
                local_1a0[2] = fVar148 * (local_260._8_4_ + 2.0);
                local_1a0[3] = fVar148 * (local_260._12_4_ + 3.0);
                fStack_190 = fVar148 * (local_260._16_4_ + 4.0);
                fStack_18c = fVar148 * (local_260._20_4_ + 5.0);
                fStack_188 = fVar148 * (local_260._24_4_ + 6.0);
                fStack_184 = local_260._28_4_ + 7.0;
                local_180 = local_240;
                local_160 = local_220;
                local_360 = 0;
                uVar55 = (ulong)((byte)uVar138 & bVar62);
                for (uVar63 = uVar55; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000)
                {
                  local_360 = local_360 + 1;
                }
                local_550 = vpbroadcastd_avx512vl();
                local_1fc = iVar6;
                while (auVar79 = auVar187._0_16_, uVar55 != 0) {
                  uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_2d0 = local_1a0[local_360];
                  local_2c0 = *(undefined4 *)(local_180 + local_360 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + local_360 * 4);
                  local_580.context = context->user;
                  fVar166 = 1.0 - local_2d0;
                  fVar148 = fVar166 * fVar166 * -3.0;
                  auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),
                                            ZEXT416((uint)(local_2d0 * fVar166)),ZEXT416(0xc0000000)
                                           );
                  auVar81 = vfmsub132ss_fma(ZEXT416((uint)(local_2d0 * fVar166)),
                                            ZEXT416((uint)(local_2d0 * local_2d0)),
                                            ZEXT416(0x40000000));
                  fVar166 = auVar84._0_4_ * 3.0;
                  fVar169 = auVar81._0_4_ * 3.0;
                  fVar170 = local_2d0 * local_2d0 * 3.0;
                  auVar160._0_4_ = fVar170 * (float)local_370._0_4_;
                  auVar160._4_4_ = fVar170 * (float)local_370._4_4_;
                  auVar160._8_4_ = fVar170 * fStack_368;
                  auVar160._12_4_ = fVar170 * fStack_364;
                  auVar134._4_4_ = fVar169;
                  auVar134._0_4_ = fVar169;
                  auVar134._8_4_ = fVar169;
                  auVar134._12_4_ = fVar169;
                  auVar84 = vfmadd132ps_fma(auVar134,auVar160,local_530);
                  auVar149._4_4_ = fVar166;
                  auVar149._0_4_ = fVar166;
                  auVar149._8_4_ = fVar166;
                  auVar149._12_4_ = fVar166;
                  auVar84 = vfmadd132ps_fma(auVar149,auVar84,local_520);
                  auVar135._4_4_ = fVar148;
                  auVar135._0_4_ = fVar148;
                  auVar135._8_4_ = fVar148;
                  auVar135._12_4_ = fVar148;
                  auVar84 = vfmadd132ps_fma(auVar135,auVar84,local_510);
                  local_300 = auVar84._0_4_;
                  local_2f0 = vshufps_avx(auVar84,auVar84,0x55);
                  local_2e0 = vshufps_avx(auVar84,auVar84,0xaa);
                  local_2b0 = local_380._0_8_;
                  uStack_2a8 = local_380._8_8_;
                  local_2a0 = local_550;
                  vpcmpeqd_avx2(ZEXT1632(local_550),ZEXT1632(local_550));
                  uStack_28c = (local_580.context)->instID[0];
                  local_290 = uStack_28c;
                  uStack_288 = uStack_28c;
                  uStack_284 = uStack_28c;
                  uStack_280 = (local_580.context)->instPrimID[0];
                  uStack_27c = uStack_280;
                  uStack_278 = uStack_280;
                  uStack_274 = uStack_280;
                  local_5b0 = local_390;
                  local_580.valid = (int *)local_5b0;
                  local_580.geometryUserPtr = pGVar56->userPtr;
                  local_580.hit = (RTCHitN *)&local_300;
                  local_580.N = 4;
                  local_340 = (uint)uVar55;
                  uStack_33c = (uint)(uVar55 >> 0x20);
                  local_580.ray = (RTCRayN *)ray;
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  fStack_2cc = local_2d0;
                  fStack_2c8 = local_2d0;
                  fStack_2c4 = local_2d0;
                  uStack_2bc = local_2c0;
                  uStack_2b8 = local_2c0;
                  uStack_2b4 = local_2c0;
                  if (pGVar56->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar56->occlusionFilterN)(&local_580);
                    uVar55 = CONCAT44(uStack_33c,local_340);
                    auVar195 = ZEXT3264(local_420);
                    auVar194 = ZEXT3264(local_400);
                    auVar189 = ZEXT3264(local_4a0);
                    auVar193 = ZEXT3264(local_480);
                    auVar192 = ZEXT3264(local_3e0);
                    auVar191 = ZEXT3264(local_460);
                    auVar190 = ZEXT3264(local_3c0);
                    auVar186 = ZEXT3264(local_440);
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar188 = ZEXT3264(auVar101);
                    auVar79 = vxorps_avx512vl(auVar79,auVar79);
                    auVar187 = ZEXT1664(auVar79);
                    uVar167 = local_4c0._0_4_;
                  }
                  auVar79 = auVar187._0_16_;
                  uVar63 = vptestmd_avx512vl(local_5b0,local_5b0);
                  if ((uVar63 & 0xf) != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar56->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&local_580);
                      uVar55 = CONCAT44(uStack_33c,local_340);
                      auVar195 = ZEXT3264(local_420);
                      auVar194 = ZEXT3264(local_400);
                      auVar189 = ZEXT3264(local_4a0);
                      auVar193 = ZEXT3264(local_480);
                      auVar192 = ZEXT3264(local_3e0);
                      auVar191 = ZEXT3264(local_460);
                      auVar190 = ZEXT3264(local_3c0);
                      auVar186 = ZEXT3264(local_440);
                      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar188 = ZEXT3264(auVar101);
                      auVar79 = vxorps_avx512vl(auVar79,auVar79);
                      auVar187 = ZEXT1664(auVar79);
                      uVar167 = local_4c0._0_4_;
                    }
                    auVar79 = *(undefined1 (*) [16])(local_580.ray + 0x80);
                    uVar63 = vptestmd_avx512vl(local_5b0,local_5b0);
                    uVar63 = uVar63 & 0xf;
                    auVar84 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar59 = (bool)((byte)uVar63 & 1);
                    auVar85._0_4_ = (uint)bVar59 * auVar84._0_4_ | (uint)!bVar59 * auVar79._0_4_;
                    bVar59 = (bool)((byte)(uVar63 >> 1) & 1);
                    auVar85._4_4_ = (uint)bVar59 * auVar84._4_4_ | (uint)!bVar59 * auVar79._4_4_;
                    bVar59 = (bool)((byte)(uVar63 >> 2) & 1);
                    auVar85._8_4_ = (uint)bVar59 * auVar84._8_4_ | (uint)!bVar59 * auVar79._8_4_;
                    bVar59 = SUB81(uVar63 >> 3,0);
                    auVar85._12_4_ = (uint)bVar59 * auVar84._12_4_ | (uint)!bVar59 * auVar79._12_4_;
                    *(undefined1 (*) [16])(local_580.ray + 0x80) = auVar85;
                    if ((byte)uVar63 != 0) {
                      bVar59 = true;
                      goto LAB_0191fbe0;
                    }
                  }
                  *(undefined4 *)(ray + k * 4 + 0x80) = uVar132;
                  uVar63 = local_360 & 0x3f;
                  local_360 = 0;
                  uVar55 = uVar55 ^ 1L << uVar63;
                  for (uVar63 = uVar55; (uVar63 & 1) == 0; uVar63 = uVar63 >> 1 | 0x8000000000000000
                      ) {
                    local_360 = local_360 + 1;
                  }
                }
              }
            }
          }
        }
        bVar59 = false;
      }
    }
LAB_0191fbe0:
    if (8 < iVar6) {
      local_4c0 = vpbroadcastd_avx512vl();
      fStack_31c = local_320;
      fStack_318 = local_320;
      fStack_314 = local_320;
      fStack_310 = local_320;
      fStack_30c = local_320;
      fStack_308 = local_320;
      fStack_304 = local_320;
      fStack_358 = 1.0 / (float)local_540._0_4_;
      local_540 = vpbroadcastd_avx512vl();
      fStack_354 = fStack_358;
      fStack_350 = fStack_358;
      fStack_34c = fStack_358;
      fStack_348 = fStack_358;
      fStack_344 = fStack_358;
      local_340 = uVar167;
      uStack_33c = uVar167;
      uStack_338 = uVar167;
      uStack_334 = uVar167;
      uStack_330 = uVar167;
      uStack_32c = uVar167;
      uStack_328 = uVar167;
      uStack_324 = uVar167;
      local_360._0_4_ = fStack_358;
      local_360._4_4_ = fStack_358;
      for (lVar57 = 8; lVar57 < iVar6; lVar57 = lVar57 + 8) {
        auVar101 = vpbroadcastd_avx512vl();
        auVar87 = vpor_avx2(auVar101,_DAT_01fb4ba0);
        uVar21 = vpcmpd_avx512vl(auVar87,local_4c0,1);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar57 * 4 + lVar61);
        auVar102 = *(undefined1 (*) [32])(lVar61 + 0x21fb768 + lVar57 * 4);
        auVar100 = *(undefined1 (*) [32])(lVar61 + 0x21fbbec + lVar57 * 4);
        auVar99 = *(undefined1 (*) [32])(lVar61 + 0x21fc070 + lVar57 * 4);
        local_400 = auVar194._0_32_;
        auVar88 = vmulps_avx512vl(local_400,auVar99);
        local_420 = auVar195._0_32_;
        auVar98 = vmulps_avx512vl(local_420,auVar99);
        auVar33._4_4_ = auVar99._4_4_ * (float)local_e0._4_4_;
        auVar33._0_4_ = auVar99._0_4_ * (float)local_e0._0_4_;
        auVar33._8_4_ = auVar99._8_4_ * fStack_d8;
        auVar33._12_4_ = auVar99._12_4_ * fStack_d4;
        auVar33._16_4_ = auVar99._16_4_ * fStack_d0;
        auVar33._20_4_ = auVar99._20_4_ * fStack_cc;
        auVar33._24_4_ = auVar99._24_4_ * fStack_c8;
        auVar33._28_4_ = auVar87._28_4_;
        auVar106 = auVar193._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar88,auVar100,auVar106);
        auVar104 = auVar189._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar104);
        auVar98 = vfmadd231ps_avx512vl(auVar33,auVar100,local_c0);
        auVar105 = auVar191._0_32_;
        auVar87 = vfmadd231ps_avx512vl(auVar87,auVar102,auVar105);
        local_3e0 = auVar192._0_32_;
        auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_3e0);
        auVar79 = vfmadd231ps_fma(auVar98,auVar102,local_a0);
        auVar103 = auVar186._0_32_;
        auVar91 = vfmadd231ps_avx512vl(auVar87,auVar101,auVar103);
        local_3c0 = auVar190._0_32_;
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar101,local_3c0);
        auVar87 = *(undefined1 (*) [32])(bezier_basis1 + lVar57 * 4 + lVar61);
        auVar88 = *(undefined1 (*) [32])(lVar61 + 0x21fdb88 + lVar57 * 4);
        auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar101,local_80);
        auVar98 = *(undefined1 (*) [32])(lVar61 + 0x21fe00c + lVar57 * 4);
        auVar97 = *(undefined1 (*) [32])(lVar61 + 0x21fe490 + lVar57 * 4);
        auVar89 = vmulps_avx512vl(local_400,auVar97);
        auVar90 = vmulps_avx512vl(local_420,auVar97);
        auVar34._4_4_ = auVar97._4_4_ * (float)local_e0._4_4_;
        auVar34._0_4_ = auVar97._0_4_ * (float)local_e0._0_4_;
        auVar34._8_4_ = auVar97._8_4_ * fStack_d8;
        auVar34._12_4_ = auVar97._12_4_ * fStack_d4;
        auVar34._16_4_ = auVar97._16_4_ * fStack_d0;
        auVar34._20_4_ = auVar97._20_4_ * fStack_cc;
        auVar34._24_4_ = auVar97._24_4_ * fStack_c8;
        auVar34._28_4_ = uStack_c4;
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar98,auVar106);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar98,auVar104);
        auVar93 = vfmadd231ps_avx512vl(auVar34,auVar98,local_c0);
        auVar89 = vfmadd231ps_avx512vl(auVar89,auVar88,auVar105);
        auVar90 = vfmadd231ps_avx512vl(auVar90,auVar88,local_3e0);
        auVar84 = vfmadd231ps_fma(auVar93,auVar88,local_a0);
        auVar93 = vfmadd231ps_avx512vl(auVar89,auVar87,auVar103);
        auVar94 = vfmadd231ps_avx512vl(auVar90,auVar87,local_3c0);
        auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar87,local_80);
        auVar95 = vmaxps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar84));
        auVar89 = vsubps_avx(auVar93,auVar91);
        auVar90 = vsubps_avx(auVar94,auVar92);
        auVar96 = vmulps_avx512vl(auVar92,auVar89);
        auVar113 = vmulps_avx512vl(auVar91,auVar90);
        auVar96 = vsubps_avx512vl(auVar96,auVar113);
        auVar113 = vmulps_avx512vl(auVar90,auVar90);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar89,auVar89);
        auVar95 = vmulps_avx512vl(auVar95,auVar95);
        auVar95 = vmulps_avx512vl(auVar95,auVar113);
        auVar96 = vmulps_avx512vl(auVar96,auVar96);
        uVar138 = vcmpps_avx512vl(auVar96,auVar95,2);
        bVar62 = (byte)uVar21 & (byte)uVar138;
        if (bVar62 == 0) {
          auVar186 = ZEXT3264(auVar103);
        }
        else {
          auVar97 = vmulps_avx512vl(local_500,auVar97);
          auVar98 = vfmadd213ps_avx512vl(auVar98,local_140,auVar97);
          auVar88 = vfmadd213ps_avx512vl(auVar88,local_120,auVar98);
          auVar87 = vfmadd213ps_avx512vl(auVar87,local_100,auVar88);
          auVar99 = vmulps_avx512vl(local_500,auVar99);
          auVar100 = vfmadd213ps_avx512vl(auVar100,local_140,auVar99);
          auVar102 = vfmadd213ps_avx512vl(auVar102,local_120,auVar100);
          auVar88 = vfmadd213ps_avx512vl(auVar101,local_100,auVar102);
          auVar101 = *(undefined1 (*) [32])(lVar61 + 0x21fc4f4 + lVar57 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar61 + 0x21fc978 + lVar57 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar61 + 0x21fcdfc + lVar57 * 4);
          auVar99 = *(undefined1 (*) [32])(lVar61 + 0x21fd280 + lVar57 * 4);
          auVar98 = vmulps_avx512vl(local_400,auVar99);
          auVar97 = vmulps_avx512vl(local_420,auVar99);
          auVar99 = vmulps_avx512vl(local_500,auVar99);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar100,auVar106);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar100,auVar104);
          auVar100 = vfmadd231ps_avx512vl(auVar99,local_140,auVar100);
          auVar99 = vfmadd231ps_avx512vl(auVar98,auVar102,auVar105);
          auVar98 = vfmadd231ps_avx512vl(auVar97,auVar102,local_3e0);
          auVar102 = vfmadd231ps_avx512vl(auVar100,local_120,auVar102);
          auVar99 = vfmadd231ps_avx512vl(auVar99,auVar101,auVar103);
          auVar98 = vfmadd231ps_avx512vl(auVar98,auVar101,local_3c0);
          auVar97 = vfmadd231ps_avx512vl(auVar102,local_100,auVar101);
          auVar101 = *(undefined1 (*) [32])(lVar61 + 0x21fe914 + lVar57 * 4);
          auVar102 = *(undefined1 (*) [32])(lVar61 + 0x21ff21c + lVar57 * 4);
          auVar100 = *(undefined1 (*) [32])(lVar61 + 0x21ff6a0 + lVar57 * 4);
          auVar95 = vmulps_avx512vl(local_400,auVar100);
          auVar96 = vmulps_avx512vl(local_420,auVar100);
          auVar100 = vmulps_avx512vl(local_500,auVar100);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar106);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar104);
          auVar100 = vfmadd231ps_avx512vl(auVar100,local_140,auVar102);
          auVar102 = *(undefined1 (*) [32])(lVar61 + 0x21fed98 + lVar57 * 4);
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar102,auVar105);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,local_3e0);
          auVar102 = vfmadd231ps_avx512vl(auVar100,local_120,auVar102);
          auVar100 = vfmadd231ps_avx512vl(auVar95,auVar101,auVar103);
          auVar95 = vfmadd231ps_avx512vl(auVar96,auVar101,local_3c0);
          auVar102 = vfmadd231ps_avx512vl(auVar102,local_100,auVar101);
          auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar99,auVar96);
          vandps_avx512vl(auVar98,auVar96);
          auVar101 = vmaxps_avx(auVar96,auVar96);
          vandps_avx512vl(auVar97,auVar96);
          auVar101 = vmaxps_avx(auVar101,auVar96);
          auVar52._4_4_ = fStack_31c;
          auVar52._0_4_ = local_320;
          auVar52._8_4_ = fStack_318;
          auVar52._12_4_ = fStack_314;
          auVar52._16_4_ = fStack_310;
          auVar52._20_4_ = fStack_30c;
          auVar52._24_4_ = fStack_308;
          auVar52._28_4_ = fStack_304;
          uVar63 = vcmpps_avx512vl(auVar101,auVar52,1);
          bVar11 = (bool)((byte)uVar63 & 1);
          auVar114._0_4_ = (float)((uint)bVar11 * auVar89._0_4_ | (uint)!bVar11 * auVar99._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar114._4_4_ = (float)((uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * auVar99._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar114._8_4_ = (float)((uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * auVar99._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar114._12_4_ = (float)((uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * auVar99._12_4_);
          bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar114._16_4_ = (float)((uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * auVar99._16_4_);
          bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar114._20_4_ = (float)((uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * auVar99._20_4_);
          bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar114._24_4_ = (float)((uint)bVar11 * auVar89._24_4_ | (uint)!bVar11 * auVar99._24_4_);
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar114._28_4_ = (uint)bVar11 * auVar89._28_4_ | (uint)!bVar11 * auVar99._28_4_;
          bVar11 = (bool)((byte)uVar63 & 1);
          auVar115._0_4_ = (float)((uint)bVar11 * auVar90._0_4_ | (uint)!bVar11 * auVar98._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar115._4_4_ = (float)((uint)bVar11 * auVar90._4_4_ | (uint)!bVar11 * auVar98._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar115._8_4_ = (float)((uint)bVar11 * auVar90._8_4_ | (uint)!bVar11 * auVar98._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar115._12_4_ = (float)((uint)bVar11 * auVar90._12_4_ | (uint)!bVar11 * auVar98._12_4_);
          bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar115._16_4_ = (float)((uint)bVar11 * auVar90._16_4_ | (uint)!bVar11 * auVar98._16_4_);
          bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar115._20_4_ = (float)((uint)bVar11 * auVar90._20_4_ | (uint)!bVar11 * auVar98._20_4_);
          bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar115._24_4_ = (float)((uint)bVar11 * auVar90._24_4_ | (uint)!bVar11 * auVar98._24_4_);
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar115._28_4_ = (uint)bVar11 * auVar90._28_4_ | (uint)!bVar11 * auVar98._28_4_;
          vandps_avx512vl(auVar100,auVar96);
          vandps_avx512vl(auVar95,auVar96);
          auVar101 = vmaxps_avx(auVar115,auVar115);
          vandps_avx512vl(auVar102,auVar96);
          auVar101 = vmaxps_avx(auVar101,auVar115);
          uVar63 = vcmpps_avx512vl(auVar101,auVar52,1);
          bVar11 = (bool)((byte)uVar63 & 1);
          auVar116._0_4_ = (uint)bVar11 * auVar89._0_4_ | (uint)!bVar11 * auVar100._0_4_;
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar116._4_4_ = (uint)bVar11 * auVar89._4_4_ | (uint)!bVar11 * auVar100._4_4_;
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar116._8_4_ = (uint)bVar11 * auVar89._8_4_ | (uint)!bVar11 * auVar100._8_4_;
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar116._12_4_ = (uint)bVar11 * auVar89._12_4_ | (uint)!bVar11 * auVar100._12_4_;
          bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar116._16_4_ = (uint)bVar11 * auVar89._16_4_ | (uint)!bVar11 * auVar100._16_4_;
          bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar116._20_4_ = (uint)bVar11 * auVar89._20_4_ | (uint)!bVar11 * auVar100._20_4_;
          bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar116._24_4_ = (uint)bVar11 * auVar89._24_4_ | (uint)!bVar11 * auVar100._24_4_;
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar116._28_4_ = (uint)bVar11 * auVar89._28_4_ | (uint)!bVar11 * auVar100._28_4_;
          bVar11 = (bool)((byte)uVar63 & 1);
          auVar117._0_4_ = (float)((uint)bVar11 * auVar90._0_4_ | (uint)!bVar11 * auVar95._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar117._4_4_ = (float)((uint)bVar11 * auVar90._4_4_ | (uint)!bVar11 * auVar95._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar117._8_4_ = (float)((uint)bVar11 * auVar90._8_4_ | (uint)!bVar11 * auVar95._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar117._12_4_ = (float)((uint)bVar11 * auVar90._12_4_ | (uint)!bVar11 * auVar95._12_4_);
          bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
          auVar117._16_4_ = (float)((uint)bVar11 * auVar90._16_4_ | (uint)!bVar11 * auVar95._16_4_);
          bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
          auVar117._20_4_ = (float)((uint)bVar11 * auVar90._20_4_ | (uint)!bVar11 * auVar95._20_4_);
          bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
          auVar117._24_4_ = (float)((uint)bVar11 * auVar90._24_4_ | (uint)!bVar11 * auVar95._24_4_);
          bVar11 = SUB81(uVar63 >> 7,0);
          auVar117._28_4_ = (uint)bVar11 * auVar90._28_4_ | (uint)!bVar11 * auVar95._28_4_;
          auVar172._8_4_ = 0x80000000;
          auVar172._0_8_ = 0x8000000080000000;
          auVar172._12_4_ = 0x80000000;
          auVar172._16_4_ = 0x80000000;
          auVar172._20_4_ = 0x80000000;
          auVar172._24_4_ = 0x80000000;
          auVar172._28_4_ = 0x80000000;
          auVar101 = vxorps_avx512vl(auVar116,auVar172);
          auVar95 = auVar187._0_32_;
          auVar102 = vfmadd213ps_avx512vl(auVar114,auVar114,auVar95);
          auVar81 = vfmadd231ps_fma(auVar102,auVar115,auVar115);
          auVar102 = vrsqrt14ps_avx512vl(ZEXT1632(auVar81));
          auVar185._8_4_ = 0xbf000000;
          auVar185._0_8_ = 0xbf000000bf000000;
          auVar185._12_4_ = 0xbf000000;
          auVar185._16_4_ = 0xbf000000;
          auVar185._20_4_ = 0xbf000000;
          auVar185._24_4_ = 0xbf000000;
          auVar185._28_4_ = 0xbf000000;
          fVar148 = auVar102._0_4_;
          fVar166 = auVar102._4_4_;
          fVar169 = auVar102._8_4_;
          fVar170 = auVar102._12_4_;
          fVar163 = auVar102._16_4_;
          fVar162 = auVar102._20_4_;
          fVar164 = auVar102._24_4_;
          auVar35._4_4_ = fVar166 * fVar166 * fVar166 * auVar81._4_4_ * -0.5;
          auVar35._0_4_ = fVar148 * fVar148 * fVar148 * auVar81._0_4_ * -0.5;
          auVar35._8_4_ = fVar169 * fVar169 * fVar169 * auVar81._8_4_ * -0.5;
          auVar35._12_4_ = fVar170 * fVar170 * fVar170 * auVar81._12_4_ * -0.5;
          auVar35._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
          auVar35._20_4_ = fVar162 * fVar162 * fVar162 * -0.0;
          auVar35._24_4_ = fVar164 * fVar164 * fVar164 * -0.0;
          auVar35._28_4_ = auVar115._28_4_;
          auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar102 = vfmadd231ps_avx512vl(auVar35,auVar100,auVar102);
          auVar36._4_4_ = auVar115._4_4_ * auVar102._4_4_;
          auVar36._0_4_ = auVar115._0_4_ * auVar102._0_4_;
          auVar36._8_4_ = auVar115._8_4_ * auVar102._8_4_;
          auVar36._12_4_ = auVar115._12_4_ * auVar102._12_4_;
          auVar36._16_4_ = auVar115._16_4_ * auVar102._16_4_;
          auVar36._20_4_ = auVar115._20_4_ * auVar102._20_4_;
          auVar36._24_4_ = auVar115._24_4_ * auVar102._24_4_;
          auVar36._28_4_ = 0;
          auVar37._4_4_ = auVar102._4_4_ * -auVar114._4_4_;
          auVar37._0_4_ = auVar102._0_4_ * -auVar114._0_4_;
          auVar37._8_4_ = auVar102._8_4_ * -auVar114._8_4_;
          auVar37._12_4_ = auVar102._12_4_ * -auVar114._12_4_;
          auVar37._16_4_ = auVar102._16_4_ * -auVar114._16_4_;
          auVar37._20_4_ = auVar102._20_4_ * -auVar114._20_4_;
          auVar37._24_4_ = auVar102._24_4_ * -auVar114._24_4_;
          auVar37._28_4_ = auVar115._28_4_;
          auVar99 = vmulps_avx512vl(auVar102,auVar95);
          auVar102 = vfmadd213ps_avx512vl(auVar116,auVar116,auVar95);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar117,auVar117);
          auVar98 = vrsqrt14ps_avx512vl(auVar102);
          auVar102 = vmulps_avx512vl(auVar102,auVar185);
          fVar148 = auVar98._0_4_;
          fVar166 = auVar98._4_4_;
          fVar169 = auVar98._8_4_;
          fVar170 = auVar98._12_4_;
          fVar163 = auVar98._16_4_;
          fVar162 = auVar98._20_4_;
          fVar164 = auVar98._24_4_;
          auVar38._4_4_ = fVar166 * fVar166 * fVar166 * auVar102._4_4_;
          auVar38._0_4_ = fVar148 * fVar148 * fVar148 * auVar102._0_4_;
          auVar38._8_4_ = fVar169 * fVar169 * fVar169 * auVar102._8_4_;
          auVar38._12_4_ = fVar170 * fVar170 * fVar170 * auVar102._12_4_;
          auVar38._16_4_ = fVar163 * fVar163 * fVar163 * auVar102._16_4_;
          auVar38._20_4_ = fVar162 * fVar162 * fVar162 * auVar102._20_4_;
          auVar38._24_4_ = fVar164 * fVar164 * fVar164 * auVar102._24_4_;
          auVar38._28_4_ = auVar102._28_4_;
          auVar102 = vfmadd231ps_avx512vl(auVar38,auVar100,auVar98);
          auVar39._4_4_ = auVar117._4_4_ * auVar102._4_4_;
          auVar39._0_4_ = auVar117._0_4_ * auVar102._0_4_;
          auVar39._8_4_ = auVar117._8_4_ * auVar102._8_4_;
          auVar39._12_4_ = auVar117._12_4_ * auVar102._12_4_;
          auVar39._16_4_ = auVar117._16_4_ * auVar102._16_4_;
          auVar39._20_4_ = auVar117._20_4_ * auVar102._20_4_;
          auVar39._24_4_ = auVar117._24_4_ * auVar102._24_4_;
          auVar39._28_4_ = auVar98._28_4_;
          auVar40._4_4_ = auVar102._4_4_ * auVar101._4_4_;
          auVar40._0_4_ = auVar102._0_4_ * auVar101._0_4_;
          auVar40._8_4_ = auVar102._8_4_ * auVar101._8_4_;
          auVar40._12_4_ = auVar102._12_4_ * auVar101._12_4_;
          auVar40._16_4_ = auVar102._16_4_ * auVar101._16_4_;
          auVar40._20_4_ = auVar102._20_4_ * auVar101._20_4_;
          auVar40._24_4_ = auVar102._24_4_ * auVar101._24_4_;
          auVar40._28_4_ = auVar101._28_4_;
          auVar101 = vmulps_avx512vl(auVar102,auVar95);
          auVar81 = vfmadd213ps_fma(auVar36,ZEXT1632(auVar79),auVar91);
          auVar102 = ZEXT1632(auVar79);
          auVar80 = vfmadd213ps_fma(auVar37,auVar102,auVar92);
          auVar100 = vfmadd213ps_avx512vl(auVar99,auVar102,auVar88);
          auVar98 = vfmadd213ps_avx512vl(auVar39,ZEXT1632(auVar84),auVar93);
          auVar73 = vfnmadd213ps_fma(auVar36,auVar102,auVar91);
          auVar97 = ZEXT1632(auVar84);
          auVar17 = vfmadd213ps_fma(auVar40,auVar97,auVar94);
          auVar74 = vfnmadd213ps_fma(auVar37,auVar102,auVar92);
          auVar75 = vfmadd213ps_fma(auVar101,auVar97,auVar87);
          auVar92 = ZEXT1632(auVar79);
          auVar78 = vfnmadd231ps_fma(auVar88,auVar92,auVar99);
          auVar76 = vfnmadd213ps_fma(auVar39,auVar97,auVar93);
          auVar77 = vfnmadd213ps_fma(auVar40,auVar97,auVar94);
          auVar18 = vfnmadd231ps_fma(auVar87,ZEXT1632(auVar84),auVar101);
          auVar87 = vsubps_avx512vl(auVar98,ZEXT1632(auVar73));
          auVar101 = vsubps_avx(ZEXT1632(auVar17),ZEXT1632(auVar74));
          auVar102 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar78));
          auVar41._4_4_ = auVar101._4_4_ * auVar78._4_4_;
          auVar41._0_4_ = auVar101._0_4_ * auVar78._0_4_;
          auVar41._8_4_ = auVar101._8_4_ * auVar78._8_4_;
          auVar41._12_4_ = auVar101._12_4_ * auVar78._12_4_;
          auVar41._16_4_ = auVar101._16_4_ * 0.0;
          auVar41._20_4_ = auVar101._20_4_ * 0.0;
          auVar41._24_4_ = auVar101._24_4_ * 0.0;
          auVar41._28_4_ = auVar99._28_4_;
          auVar79 = vfmsub231ps_fma(auVar41,ZEXT1632(auVar74),auVar102);
          auVar42._4_4_ = auVar102._4_4_ * auVar73._4_4_;
          auVar42._0_4_ = auVar102._0_4_ * auVar73._0_4_;
          auVar42._8_4_ = auVar102._8_4_ * auVar73._8_4_;
          auVar42._12_4_ = auVar102._12_4_ * auVar73._12_4_;
          auVar42._16_4_ = auVar102._16_4_ * 0.0;
          auVar42._20_4_ = auVar102._20_4_ * 0.0;
          auVar42._24_4_ = auVar102._24_4_ * 0.0;
          auVar42._28_4_ = auVar102._28_4_;
          auVar71 = vfmsub231ps_fma(auVar42,ZEXT1632(auVar78),auVar87);
          auVar43._4_4_ = auVar74._4_4_ * auVar87._4_4_;
          auVar43._0_4_ = auVar74._0_4_ * auVar87._0_4_;
          auVar43._8_4_ = auVar74._8_4_ * auVar87._8_4_;
          auVar43._12_4_ = auVar74._12_4_ * auVar87._12_4_;
          auVar43._16_4_ = auVar87._16_4_ * 0.0;
          auVar43._20_4_ = auVar87._20_4_ * 0.0;
          auVar43._24_4_ = auVar87._24_4_ * 0.0;
          auVar43._28_4_ = auVar87._28_4_;
          auVar72 = vfmsub231ps_fma(auVar43,ZEXT1632(auVar73),auVar101);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar72),auVar95,ZEXT1632(auVar71));
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar95,ZEXT1632(auVar79));
          uVar63 = vcmpps_avx512vl(auVar101,auVar95,2);
          bVar53 = (byte)uVar63;
          fVar124 = (float)((uint)(bVar53 & 1) * auVar81._0_4_ |
                           (uint)!(bool)(bVar53 & 1) * auVar76._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar126 = (float)((uint)bVar11 * auVar81._4_4_ | (uint)!bVar11 * auVar76._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar128 = (float)((uint)bVar11 * auVar81._8_4_ | (uint)!bVar11 * auVar76._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar130 = (float)((uint)bVar11 * auVar81._12_4_ | (uint)!bVar11 * auVar76._12_4_);
          auVar97 = ZEXT1632(CONCAT412(fVar130,CONCAT48(fVar128,CONCAT44(fVar126,fVar124))));
          fVar125 = (float)((uint)(bVar53 & 1) * auVar80._0_4_ |
                           (uint)!(bool)(bVar53 & 1) * auVar77._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          fVar127 = (float)((uint)bVar11 * auVar80._4_4_ | (uint)!bVar11 * auVar77._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          fVar129 = (float)((uint)bVar11 * auVar80._8_4_ | (uint)!bVar11 * auVar77._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          fVar131 = (float)((uint)bVar11 * auVar80._12_4_ | (uint)!bVar11 * auVar77._12_4_);
          auVar89 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar125))));
          auVar118._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar100._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar18._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar118._4_4_ = (float)((uint)bVar11 * auVar100._4_4_ | (uint)!bVar11 * auVar18._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar118._8_4_ = (float)((uint)bVar11 * auVar100._8_4_ | (uint)!bVar11 * auVar18._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar118._12_4_ = (float)((uint)bVar11 * auVar100._12_4_ | (uint)!bVar11 * auVar18._12_4_)
          ;
          fVar169 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar100._16_4_);
          auVar118._16_4_ = fVar169;
          fVar166 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar100._20_4_);
          auVar118._20_4_ = fVar166;
          fVar148 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar100._24_4_);
          auVar118._24_4_ = fVar148;
          iVar1 = (uint)(byte)(uVar63 >> 7) * auVar100._28_4_;
          auVar118._28_4_ = iVar1;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar73),auVar98);
          auVar119._0_4_ =
               (uint)(bVar53 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar79._0_4_;
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar119._4_4_ = (uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar79._4_4_;
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar119._8_4_ = (uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar79._8_4_;
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar119._12_4_ = (uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar79._12_4_;
          auVar119._16_4_ = (uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_;
          auVar119._20_4_ = (uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_;
          auVar119._24_4_ = (uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_;
          auVar119._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar74),ZEXT1632(auVar17));
          auVar120._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar81._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar120._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar81._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar120._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar81._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar120._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar81._12_4_)
          ;
          fVar162 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_);
          auVar120._16_4_ = fVar162;
          fVar163 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_);
          auVar120._20_4_ = fVar163;
          fVar170 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_);
          auVar120._24_4_ = fVar170;
          auVar120._28_4_ = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
          auVar101 = vblendmps_avx512vl(ZEXT1632(auVar78),ZEXT1632(auVar75));
          auVar121._0_4_ =
               (float)((uint)(bVar53 & 1) * auVar101._0_4_ |
                      (uint)!(bool)(bVar53 & 1) * auVar80._0_4_);
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar121._4_4_ = (float)((uint)bVar11 * auVar101._4_4_ | (uint)!bVar11 * auVar80._4_4_);
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar121._8_4_ = (float)((uint)bVar11 * auVar101._8_4_ | (uint)!bVar11 * auVar80._8_4_);
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar121._12_4_ = (float)((uint)bVar11 * auVar101._12_4_ | (uint)!bVar11 * auVar80._12_4_)
          ;
          fVar65 = (float)((uint)((byte)(uVar63 >> 4) & 1) * auVar101._16_4_);
          auVar121._16_4_ = fVar65;
          fVar64 = (float)((uint)((byte)(uVar63 >> 5) & 1) * auVar101._20_4_);
          auVar121._20_4_ = fVar64;
          fVar164 = (float)((uint)((byte)(uVar63 >> 6) & 1) * auVar101._24_4_);
          auVar121._24_4_ = fVar164;
          iVar2 = (uint)(byte)(uVar63 >> 7) * auVar101._28_4_;
          auVar121._28_4_ = iVar2;
          auVar122._0_4_ =
               (uint)(bVar53 & 1) * (int)auVar73._0_4_ | (uint)!(bool)(bVar53 & 1) * auVar98._0_4_;
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar11 * (int)auVar73._4_4_ | (uint)!bVar11 * auVar98._4_4_;
          bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar11 * (int)auVar73._8_4_ | (uint)!bVar11 * auVar98._8_4_;
          bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar11 * (int)auVar73._12_4_ | (uint)!bVar11 * auVar98._12_4_;
          auVar122._16_4_ = (uint)!(bool)((byte)(uVar63 >> 4) & 1) * auVar98._16_4_;
          auVar122._20_4_ = (uint)!(bool)((byte)(uVar63 >> 5) & 1) * auVar98._20_4_;
          auVar122._24_4_ = (uint)!(bool)((byte)(uVar63 >> 6) & 1) * auVar98._24_4_;
          auVar122._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar98._28_4_;
          bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar63 >> 3) & 1);
          bVar12 = (bool)((byte)(uVar63 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar63 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar63 >> 3) & 1);
          auVar98 = vsubps_avx512vl(auVar122,auVar97);
          auVar102 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar74._12_4_ |
                                                   (uint)!bVar15 * auVar17._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar74._8_4_ |
                                                            (uint)!bVar14 * auVar17._8_4_,
                                                            CONCAT44((uint)bVar11 *
                                                                     (int)auVar74._4_4_ |
                                                                     (uint)!bVar11 * auVar17._4_4_,
                                                                     (uint)(bVar53 & 1) *
                                                                     (int)auVar74._0_4_ |
                                                                     (uint)!(bool)(bVar53 & 1) *
                                                                     auVar17._0_4_)))),auVar89);
          auVar100 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar78._12_4_ |
                                                   (uint)!bVar16 * auVar75._12_4_,
                                                   CONCAT48((uint)bVar13 * (int)auVar78._8_4_ |
                                                            (uint)!bVar13 * auVar75._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar78._4_4_ |
                                                                     (uint)!bVar12 * auVar75._4_4_,
                                                                     (uint)(bVar53 & 1) *
                                                                     (int)auVar78._0_4_ |
                                                                     (uint)!(bool)(bVar53 & 1) *
                                                                     auVar75._0_4_)))),auVar118);
          auVar99 = vsubps_avx(auVar97,auVar119);
          auVar87 = vsubps_avx(auVar89,auVar120);
          auVar88 = vsubps_avx(auVar118,auVar121);
          auVar44._4_4_ = auVar100._4_4_ * fVar126;
          auVar44._0_4_ = auVar100._0_4_ * fVar124;
          auVar44._8_4_ = auVar100._8_4_ * fVar128;
          auVar44._12_4_ = auVar100._12_4_ * fVar130;
          auVar44._16_4_ = auVar100._16_4_ * 0.0;
          auVar44._20_4_ = auVar100._20_4_ * 0.0;
          auVar44._24_4_ = auVar100._24_4_ * 0.0;
          auVar44._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar44,auVar118,auVar98);
          auVar152._0_4_ = fVar125 * auVar98._0_4_;
          auVar152._4_4_ = fVar127 * auVar98._4_4_;
          auVar152._8_4_ = fVar129 * auVar98._8_4_;
          auVar152._12_4_ = fVar131 * auVar98._12_4_;
          auVar152._16_4_ = auVar98._16_4_ * 0.0;
          auVar152._20_4_ = auVar98._20_4_ * 0.0;
          auVar152._24_4_ = auVar98._24_4_ * 0.0;
          auVar152._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar152,auVar97,auVar102);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar95,ZEXT1632(auVar79));
          auVar157._0_4_ = auVar102._0_4_ * auVar118._0_4_;
          auVar157._4_4_ = auVar102._4_4_ * auVar118._4_4_;
          auVar157._8_4_ = auVar102._8_4_ * auVar118._8_4_;
          auVar157._12_4_ = auVar102._12_4_ * auVar118._12_4_;
          auVar157._16_4_ = auVar102._16_4_ * fVar169;
          auVar157._20_4_ = auVar102._20_4_ * fVar166;
          auVar157._24_4_ = auVar102._24_4_ * fVar148;
          auVar157._28_4_ = 0;
          auVar79 = vfmsub231ps_fma(auVar157,auVar89,auVar100);
          auVar90 = vfmadd231ps_avx512vl(auVar101,auVar95,ZEXT1632(auVar79));
          auVar101 = vmulps_avx512vl(auVar88,auVar119);
          auVar101 = vfmsub231ps_avx512vl(auVar101,auVar99,auVar121);
          auVar45._4_4_ = auVar87._4_4_ * auVar121._4_4_;
          auVar45._0_4_ = auVar87._0_4_ * auVar121._0_4_;
          auVar45._8_4_ = auVar87._8_4_ * auVar121._8_4_;
          auVar45._12_4_ = auVar87._12_4_ * auVar121._12_4_;
          auVar45._16_4_ = auVar87._16_4_ * fVar65;
          auVar45._20_4_ = auVar87._20_4_ * fVar64;
          auVar45._24_4_ = auVar87._24_4_ * fVar164;
          auVar45._28_4_ = iVar2;
          auVar79 = vfmsub231ps_fma(auVar45,auVar120,auVar88);
          auVar158._0_4_ = auVar120._0_4_ * auVar99._0_4_;
          auVar158._4_4_ = auVar120._4_4_ * auVar99._4_4_;
          auVar158._8_4_ = auVar120._8_4_ * auVar99._8_4_;
          auVar158._12_4_ = auVar120._12_4_ * auVar99._12_4_;
          auVar158._16_4_ = fVar162 * auVar99._16_4_;
          auVar158._20_4_ = fVar163 * auVar99._20_4_;
          auVar158._24_4_ = fVar170 * auVar99._24_4_;
          auVar158._28_4_ = 0;
          auVar81 = vfmsub231ps_fma(auVar158,auVar87,auVar119);
          auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar81),auVar95,auVar101);
          auVar91 = vfmadd231ps_avx512vl(auVar101,auVar95,ZEXT1632(auVar79));
          auVar101 = vmaxps_avx(auVar90,auVar91);
          uVar138 = vcmpps_avx512vl(auVar101,auVar95,2);
          bVar62 = bVar62 & (byte)uVar138;
          if (bVar62 != 0) {
            auVar46._4_4_ = auVar88._4_4_ * auVar102._4_4_;
            auVar46._0_4_ = auVar88._0_4_ * auVar102._0_4_;
            auVar46._8_4_ = auVar88._8_4_ * auVar102._8_4_;
            auVar46._12_4_ = auVar88._12_4_ * auVar102._12_4_;
            auVar46._16_4_ = auVar88._16_4_ * auVar102._16_4_;
            auVar46._20_4_ = auVar88._20_4_ * auVar102._20_4_;
            auVar46._24_4_ = auVar88._24_4_ * auVar102._24_4_;
            auVar46._28_4_ = auVar101._28_4_;
            auVar80 = vfmsub231ps_fma(auVar46,auVar87,auVar100);
            auVar47._4_4_ = auVar100._4_4_ * auVar99._4_4_;
            auVar47._0_4_ = auVar100._0_4_ * auVar99._0_4_;
            auVar47._8_4_ = auVar100._8_4_ * auVar99._8_4_;
            auVar47._12_4_ = auVar100._12_4_ * auVar99._12_4_;
            auVar47._16_4_ = auVar100._16_4_ * auVar99._16_4_;
            auVar47._20_4_ = auVar100._20_4_ * auVar99._20_4_;
            auVar47._24_4_ = auVar100._24_4_ * auVar99._24_4_;
            auVar47._28_4_ = auVar100._28_4_;
            auVar81 = vfmsub231ps_fma(auVar47,auVar98,auVar88);
            auVar48._4_4_ = auVar87._4_4_ * auVar98._4_4_;
            auVar48._0_4_ = auVar87._0_4_ * auVar98._0_4_;
            auVar48._8_4_ = auVar87._8_4_ * auVar98._8_4_;
            auVar48._12_4_ = auVar87._12_4_ * auVar98._12_4_;
            auVar48._16_4_ = auVar87._16_4_ * auVar98._16_4_;
            auVar48._20_4_ = auVar87._20_4_ * auVar98._20_4_;
            auVar48._24_4_ = auVar87._24_4_ * auVar98._24_4_;
            auVar48._28_4_ = auVar87._28_4_;
            auVar17 = vfmsub231ps_fma(auVar48,auVar99,auVar102);
            auVar79 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar81),ZEXT1632(auVar17));
            auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar79),ZEXT1632(auVar80),auVar95);
            auVar102 = vrcp14ps_avx512vl(auVar101);
            auVar99 = auVar188._0_32_;
            auVar100 = vfnmadd213ps_avx512vl(auVar102,auVar101,auVar99);
            auVar79 = vfmadd132ps_fma(auVar100,auVar102,auVar102);
            auVar49._4_4_ = auVar17._4_4_ * auVar118._4_4_;
            auVar49._0_4_ = auVar17._0_4_ * auVar118._0_4_;
            auVar49._8_4_ = auVar17._8_4_ * auVar118._8_4_;
            auVar49._12_4_ = auVar17._12_4_ * auVar118._12_4_;
            auVar49._16_4_ = fVar169 * 0.0;
            auVar49._20_4_ = fVar166 * 0.0;
            auVar49._24_4_ = fVar148 * 0.0;
            auVar49._28_4_ = iVar1;
            auVar81 = vfmadd231ps_fma(auVar49,auVar89,ZEXT1632(auVar81));
            auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar97,ZEXT1632(auVar80));
            fVar148 = auVar79._0_4_;
            fVar166 = auVar79._4_4_;
            fVar169 = auVar79._8_4_;
            fVar170 = auVar79._12_4_;
            local_220 = ZEXT1632(CONCAT412(auVar81._12_4_ * fVar170,
                                           CONCAT48(auVar81._8_4_ * fVar169,
                                                    CONCAT44(auVar81._4_4_ * fVar166,
                                                             auVar81._0_4_ * fVar148))));
            auVar51._4_4_ = uStack_33c;
            auVar51._0_4_ = local_340;
            auVar51._8_4_ = uStack_338;
            auVar51._12_4_ = uStack_334;
            auVar51._16_4_ = uStack_330;
            auVar51._20_4_ = uStack_32c;
            auVar51._24_4_ = uStack_328;
            auVar51._28_4_ = uStack_324;
            uVar138 = vcmpps_avx512vl(local_220,auVar51,0xd);
            uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar25._4_4_ = uVar132;
            auVar25._0_4_ = uVar132;
            auVar25._8_4_ = uVar132;
            auVar25._12_4_ = uVar132;
            auVar25._16_4_ = uVar132;
            auVar25._20_4_ = uVar132;
            auVar25._24_4_ = uVar132;
            auVar25._28_4_ = uVar132;
            uVar21 = vcmpps_avx512vl(local_220,auVar25,2);
            bVar62 = (byte)uVar138 & (byte)uVar21 & bVar62;
            if (bVar62 != 0) {
              uVar138 = vcmpps_avx512vl(auVar101,auVar95,4);
              bVar62 = bVar62 & (byte)uVar138;
              auVar186 = ZEXT3264(auVar103);
              if (bVar62 != 0) {
                fVar163 = auVar90._0_4_ * fVar148;
                fVar162 = auVar90._4_4_ * fVar166;
                auVar50._4_4_ = fVar162;
                auVar50._0_4_ = fVar163;
                fVar164 = auVar90._8_4_ * fVar169;
                auVar50._8_4_ = fVar164;
                fVar64 = auVar90._12_4_ * fVar170;
                auVar50._12_4_ = fVar64;
                fVar65 = auVar90._16_4_ * 0.0;
                auVar50._16_4_ = fVar65;
                fVar124 = auVar90._20_4_ * 0.0;
                auVar50._20_4_ = fVar124;
                fVar125 = auVar90._24_4_ * 0.0;
                auVar50._24_4_ = fVar125;
                auVar50._28_4_ = auVar101._28_4_;
                auVar102 = vsubps_avx512vl(auVar99,auVar50);
                local_260._0_4_ =
                     (float)((uint)(bVar53 & 1) * (int)fVar163 |
                            (uint)!(bool)(bVar53 & 1) * auVar102._0_4_);
                bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
                local_260._4_4_ =
                     (float)((uint)bVar11 * (int)fVar162 | (uint)!bVar11 * auVar102._4_4_);
                bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
                local_260._8_4_ =
                     (float)((uint)bVar11 * (int)fVar164 | (uint)!bVar11 * auVar102._8_4_);
                bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
                local_260._12_4_ =
                     (float)((uint)bVar11 * (int)fVar64 | (uint)!bVar11 * auVar102._12_4_);
                bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
                local_260._16_4_ =
                     (float)((uint)bVar11 * (int)fVar65 | (uint)!bVar11 * auVar102._16_4_);
                bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
                local_260._20_4_ =
                     (float)((uint)bVar11 * (int)fVar124 | (uint)!bVar11 * auVar102._20_4_);
                bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                local_260._24_4_ =
                     (float)((uint)bVar11 * (int)fVar125 | (uint)!bVar11 * auVar102._24_4_);
                bVar11 = SUB81(uVar63 >> 7,0);
                local_260._28_4_ =
                     (float)((uint)bVar11 * auVar101._28_4_ | (uint)!bVar11 * auVar102._28_4_);
                auVar101 = vsubps_avx(ZEXT1632(auVar84),auVar92);
                auVar79 = vfmadd213ps_fma(auVar101,local_260,auVar92);
                uVar132 = *(undefined4 *)((long)local_598->ray_space + k * 4 + -0x10);
                auVar26._4_4_ = uVar132;
                auVar26._0_4_ = uVar132;
                auVar26._8_4_ = uVar132;
                auVar26._12_4_ = uVar132;
                auVar26._16_4_ = uVar132;
                auVar26._20_4_ = uVar132;
                auVar26._24_4_ = uVar132;
                auVar26._28_4_ = uVar132;
                auVar101 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar79._12_4_ + auVar79._12_4_,
                                                              CONCAT48(auVar79._8_4_ + auVar79._8_4_
                                                                       ,CONCAT44(auVar79._4_4_ +
                                                                                 auVar79._4_4_,
                                                                                 auVar79._0_4_ +
                                                                                 auVar79._0_4_)))),
                                           auVar26);
                uVar138 = vcmpps_avx512vl(local_220,auVar101,6);
                if (((byte)uVar138 & bVar62) != 0) {
                  auVar143._0_4_ = auVar91._0_4_ * fVar148;
                  auVar143._4_4_ = auVar91._4_4_ * fVar166;
                  auVar143._8_4_ = auVar91._8_4_ * fVar169;
                  auVar143._12_4_ = auVar91._12_4_ * fVar170;
                  auVar143._16_4_ = auVar91._16_4_ * 0.0;
                  auVar143._20_4_ = auVar91._20_4_ * 0.0;
                  auVar143._24_4_ = auVar91._24_4_ * 0.0;
                  auVar143._28_4_ = 0;
                  auVar101 = vsubps_avx512vl(auVar99,auVar143);
                  auVar123._0_4_ =
                       (uint)(bVar53 & 1) * (int)auVar143._0_4_ |
                       (uint)!(bool)(bVar53 & 1) * auVar101._0_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
                  auVar123._4_4_ =
                       (uint)bVar11 * (int)auVar143._4_4_ | (uint)!bVar11 * auVar101._4_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
                  auVar123._8_4_ =
                       (uint)bVar11 * (int)auVar143._8_4_ | (uint)!bVar11 * auVar101._8_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 3) & 1);
                  auVar123._12_4_ =
                       (uint)bVar11 * (int)auVar143._12_4_ | (uint)!bVar11 * auVar101._12_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 4) & 1);
                  auVar123._16_4_ =
                       (uint)bVar11 * (int)auVar143._16_4_ | (uint)!bVar11 * auVar101._16_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 5) & 1);
                  auVar123._20_4_ =
                       (uint)bVar11 * (int)auVar143._20_4_ | (uint)!bVar11 * auVar101._20_4_;
                  bVar11 = (bool)((byte)(uVar63 >> 6) & 1);
                  auVar123._24_4_ =
                       (uint)bVar11 * (int)auVar143._24_4_ | (uint)!bVar11 * auVar101._24_4_;
                  auVar123._28_4_ = (uint)!SUB81(uVar63 >> 7,0) * auVar101._28_4_;
                  auVar27._8_4_ = 0x40000000;
                  auVar27._0_8_ = 0x4000000040000000;
                  auVar27._12_4_ = 0x40000000;
                  auVar27._16_4_ = 0x40000000;
                  auVar27._20_4_ = 0x40000000;
                  auVar27._24_4_ = 0x40000000;
                  auVar27._28_4_ = 0x40000000;
                  local_240 = vfmsub132ps_avx512vl(auVar123,auVar99,auVar27);
                  local_200 = (undefined4)lVar57;
                  local_1f0 = local_510._0_8_;
                  uStack_1e8 = local_510._8_8_;
                  local_1e0 = local_520._0_8_;
                  uStack_1d8 = local_520._8_8_;
                  local_1d0 = local_530._0_8_;
                  uStack_1c8 = local_530._8_8_;
                  pGVar56 = (context->scene->geometries).items[local_590].ptr;
                  if ((pGVar56->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                    bVar53 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar53 = 1, pGVar56->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar79 = vcvtsi2ss_avx512f(auVar96._0_16_,local_200);
                    fVar148 = auVar79._0_4_;
                    local_1a0[0] = (fVar148 + local_260._0_4_ + 0.0) * (float)local_360;
                    local_1a0[1] = (fVar148 + local_260._4_4_ + 1.0) * local_360._4_4_;
                    local_1a0[2] = (fVar148 + local_260._8_4_ + 2.0) * fStack_358;
                    local_1a0[3] = (fVar148 + local_260._12_4_ + 3.0) * fStack_354;
                    fStack_190 = (fVar148 + local_260._16_4_ + 4.0) * fStack_350;
                    fStack_18c = (fVar148 + local_260._20_4_ + 5.0) * fStack_34c;
                    fStack_188 = (fVar148 + local_260._24_4_ + 6.0) * fStack_348;
                    fStack_184 = fVar148 + local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    uVar63 = 0;
                    uVar58 = (ulong)((byte)uVar138 & bVar62);
                    for (uVar55 = uVar58; local_588 = pGVar56, local_1fc = iVar6, (uVar55 & 1) == 0;
                        uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                      uVar63 = uVar63 + 1;
                    }
                    while (auVar79 = auVar187._0_16_, uVar58 != 0) {
                      uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
                      local_2d0 = local_1a0[uVar63];
                      local_2c0 = *(undefined4 *)(local_180 + uVar63 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_160 + uVar63 * 4);
                      local_580.context = context->user;
                      fVar166 = 1.0 - local_2d0;
                      fVar148 = fVar166 * fVar166 * -3.0;
                      auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * fVar166)),
                                                ZEXT416((uint)(local_2d0 * fVar166)),
                                                ZEXT416(0xc0000000));
                      auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_2d0 * fVar166)),
                                                ZEXT416((uint)(local_2d0 * local_2d0)),
                                                ZEXT416(0x40000000));
                      fVar166 = auVar79._0_4_ * 3.0;
                      fVar169 = auVar84._0_4_ * 3.0;
                      fVar170 = local_2d0 * local_2d0 * 3.0;
                      auVar161._0_4_ = fVar170 * (float)local_370._0_4_;
                      auVar161._4_4_ = fVar170 * (float)local_370._4_4_;
                      auVar161._8_4_ = fVar170 * fStack_368;
                      auVar161._12_4_ = fVar170 * fStack_364;
                      auVar136._4_4_ = fVar169;
                      auVar136._0_4_ = fVar169;
                      auVar136._8_4_ = fVar169;
                      auVar136._12_4_ = fVar169;
                      auVar79 = vfmadd132ps_fma(auVar136,auVar161,local_530);
                      auVar150._4_4_ = fVar166;
                      auVar150._0_4_ = fVar166;
                      auVar150._8_4_ = fVar166;
                      auVar150._12_4_ = fVar166;
                      auVar79 = vfmadd132ps_fma(auVar150,auVar79,local_520);
                      auVar137._4_4_ = fVar148;
                      auVar137._0_4_ = fVar148;
                      auVar137._8_4_ = fVar148;
                      auVar137._12_4_ = fVar148;
                      auVar79 = vfmadd132ps_fma(auVar137,auVar79,local_510);
                      local_300 = auVar79._0_4_;
                      local_2f0 = vshufps_avx(auVar79,auVar79,0x55);
                      local_2e0 = vshufps_avx(auVar79,auVar79,0xaa);
                      local_2b0 = local_380._0_8_;
                      uStack_2a8 = local_380._8_8_;
                      local_2a0 = local_540;
                      vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                      uStack_28c = (local_580.context)->instID[0];
                      local_290 = uStack_28c;
                      uStack_288 = uStack_28c;
                      uStack_284 = uStack_28c;
                      uStack_280 = (local_580.context)->instPrimID[0];
                      uStack_27c = uStack_280;
                      uStack_278 = uStack_280;
                      uStack_274 = uStack_280;
                      local_5b0 = local_390;
                      local_580.valid = (int *)local_5b0;
                      local_580.geometryUserPtr = pGVar56->userPtr;
                      local_580.hit = (RTCHitN *)&local_300;
                      local_580.N = 4;
                      local_550._0_8_ = uVar63;
                      uVar55 = uVar63;
                      local_580.ray = (RTCRayN *)ray;
                      uStack_2fc = local_300;
                      uStack_2f8 = local_300;
                      uStack_2f4 = local_300;
                      fStack_2cc = local_2d0;
                      fStack_2c8 = local_2d0;
                      fStack_2c4 = local_2d0;
                      uStack_2bc = local_2c0;
                      uStack_2b8 = local_2c0;
                      uStack_2b4 = local_2c0;
                      if (pGVar56->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar56->occlusionFilterN)(&local_580);
                        pGVar56 = local_588;
                        uVar55 = local_550._0_8_;
                      }
                      uVar63 = vptestmd_avx512vl(local_5b0,local_5b0);
                      if ((uVar63 & 0xf) != 0) {
                        p_Var10 = context->args->filter;
                        if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar56->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var10)(&local_580);
                          pGVar56 = local_588;
                          uVar55 = local_550._0_8_;
                        }
                        auVar79 = auVar187._0_16_;
                        auVar84 = *(undefined1 (*) [16])(local_580.ray + 0x80);
                        uVar63 = vptestmd_avx512vl(local_5b0,local_5b0);
                        uVar63 = uVar63 & 0xf;
                        auVar81 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar11 = (bool)((byte)uVar63 & 1);
                        auVar86._0_4_ = (uint)bVar11 * auVar81._0_4_ | (uint)!bVar11 * auVar84._0_4_
                        ;
                        bVar11 = (bool)((byte)(uVar63 >> 1) & 1);
                        auVar86._4_4_ = (uint)bVar11 * auVar81._4_4_ | (uint)!bVar11 * auVar84._4_4_
                        ;
                        bVar11 = (bool)((byte)(uVar63 >> 2) & 1);
                        auVar86._8_4_ = (uint)bVar11 * auVar81._8_4_ | (uint)!bVar11 * auVar84._8_4_
                        ;
                        bVar11 = SUB81(uVar63 >> 3,0);
                        auVar86._12_4_ =
                             (uint)bVar11 * auVar81._12_4_ | (uint)!bVar11 * auVar84._12_4_;
                        *(undefined1 (*) [16])(local_580.ray + 0x80) = auVar86;
                        if ((byte)uVar63 != 0) {
                          bVar53 = 1;
                          goto LAB_01920616;
                        }
                      }
                      *(undefined4 *)(ray + k * 4 + 0x80) = uVar132;
                      uVar63 = 0;
                      uVar58 = uVar58 ^ 1L << (uVar55 & 0x3f);
                      for (uVar55 = uVar58; (uVar55 & 1) == 0;
                          uVar55 = uVar55 >> 1 | 0x8000000000000000) {
                        uVar63 = uVar63 + 1;
                      }
                    }
                    bVar53 = 0;
LAB_01920616:
                    auVar79 = vxorps_avx512vl(auVar79,auVar79);
                    auVar187 = ZEXT1664(auVar79);
                    auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar188 = ZEXT3264(auVar101);
                    auVar186 = ZEXT3264(local_440);
                    auVar190 = ZEXT3264(local_3c0);
                    auVar191 = ZEXT3264(local_460);
                    auVar192 = ZEXT3264(local_3e0);
                    auVar193 = ZEXT3264(local_480);
                    auVar189 = ZEXT3264(local_4a0);
                    auVar194 = ZEXT3264(local_400);
                    auVar195 = ZEXT3264(local_420);
                  }
                  bVar59 = (bool)(bVar59 | bVar53);
                }
              }
              goto LAB_019205ff;
            }
          }
          auVar186 = ZEXT3264(auVar103);
        }
LAB_019205ff:
      }
    }
    if (bVar59) break;
    uVar132 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar22._4_4_ = uVar132;
    auVar22._0_4_ = uVar132;
    auVar22._8_4_ = uVar132;
    auVar22._12_4_ = uVar132;
    uVar138 = vcmpps_avx512vl(local_270,auVar22,2);
  }
  return uVar60 != 0;
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }